

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  long lVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  byte bVar86;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  long lVar87;
  uint uVar88;
  ulong uVar89;
  bool bVar90;
  float fVar91;
  float fVar138;
  float fVar140;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar98 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar144;
  float fVar145;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar146;
  undefined4 uVar147;
  undefined8 uVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar158;
  float fVar159;
  float fVar166;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  int iStack_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int iStack_768;
  int iStack_764;
  undefined1 local_750 [16];
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined8 uStack_738;
  ulong local_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  long local_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  int local_43c;
  undefined1 local_430 [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  byte local_3f0;
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar83 = (ulong)(byte)PVar9;
  lVar71 = uVar83 * 0x19;
  fVar167 = *(float *)(prim + lVar71 + 0x12);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar96 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar97 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + lVar71 + 6));
  fVar158 = fVar167 * auVar97._0_4_;
  fVar146 = fVar167 * auVar96._0_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar21);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar95);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar94);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar92);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar114 = vpmovsxbd_avx2(auVar5);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar83 + 6);
  auVar113 = vpmovsxbd_avx2(auVar6);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar89 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar106 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar89 + uVar83 + 6);
  auVar111 = vpmovsxbd_avx2(auVar8);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar111);
  uVar85 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar101 = vpmovsxbd_avx2(auVar93);
  auVar112 = vcvtdq2ps_avx(auVar101);
  auVar193._4_4_ = fVar146;
  auVar193._0_4_ = fVar146;
  auVar193._8_4_ = fVar146;
  auVar193._12_4_ = fVar146;
  auVar193._16_4_ = fVar146;
  auVar193._20_4_ = fVar146;
  auVar193._24_4_ = fVar146;
  auVar193._28_4_ = fVar146;
  auVar196._8_4_ = 1;
  auVar196._0_8_ = 0x100000001;
  auVar196._12_4_ = 1;
  auVar196._16_4_ = 1;
  auVar196._20_4_ = 1;
  auVar196._24_4_ = 1;
  auVar196._28_4_ = 1;
  auVar108 = ZEXT1632(CONCAT412(fVar167 * auVar96._12_4_,
                                CONCAT48(fVar167 * auVar96._8_4_,
                                         CONCAT44(fVar167 * auVar96._4_4_,fVar146))));
  auVar102 = vpermps_avx2(auVar196,auVar108);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = vpermps_avx512vl(auVar99,auVar108);
  fVar146 = auVar100._0_4_;
  fVar174 = auVar100._4_4_;
  auVar108._4_4_ = fVar174 * auVar104._4_4_;
  auVar108._0_4_ = fVar146 * auVar104._0_4_;
  fVar175 = auVar100._8_4_;
  auVar108._8_4_ = fVar175 * auVar104._8_4_;
  fVar176 = auVar100._12_4_;
  auVar108._12_4_ = fVar176 * auVar104._12_4_;
  fVar159 = auVar100._16_4_;
  auVar108._16_4_ = fVar159 * auVar104._16_4_;
  fVar166 = auVar100._20_4_;
  auVar108._20_4_ = fVar166 * auVar104._20_4_;
  fVar91 = auVar100._24_4_;
  auVar108._24_4_ = fVar91 * auVar104._24_4_;
  auVar108._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar113._4_4_ * fVar174;
  auVar111._0_4_ = auVar113._0_4_ * fVar146;
  auVar111._8_4_ = auVar113._8_4_ * fVar175;
  auVar111._12_4_ = auVar113._12_4_ * fVar176;
  auVar111._16_4_ = auVar113._16_4_ * fVar159;
  auVar111._20_4_ = auVar113._20_4_ * fVar166;
  auVar111._24_4_ = auVar113._24_4_ * fVar91;
  auVar111._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar112._4_4_ * fVar174;
  auVar101._0_4_ = auVar112._0_4_ * fVar146;
  auVar101._8_4_ = auVar112._8_4_ * fVar175;
  auVar101._12_4_ = auVar112._12_4_ * fVar176;
  auVar101._16_4_ = auVar112._16_4_ * fVar159;
  auVar101._20_4_ = auVar112._20_4_ * fVar166;
  auVar101._24_4_ = auVar112._24_4_ * fVar91;
  auVar101._28_4_ = auVar100._28_4_;
  auVar21 = vfmadd231ps_fma(auVar108,auVar102,auVar103);
  auVar95 = vfmadd231ps_fma(auVar111,auVar102,auVar114);
  auVar94 = vfmadd231ps_fma(auVar101,auVar107,auVar102);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar193,auVar105);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar193,auVar115);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,auVar193);
  auVar194._4_4_ = fVar158;
  auVar194._0_4_ = fVar158;
  auVar194._8_4_ = fVar158;
  auVar194._12_4_ = fVar158;
  auVar194._16_4_ = fVar158;
  auVar194._20_4_ = fVar158;
  auVar194._24_4_ = fVar158;
  auVar194._28_4_ = fVar158;
  auVar101 = ZEXT1632(CONCAT412(fVar167 * auVar97._12_4_,
                                CONCAT48(fVar167 * auVar97._8_4_,
                                         CONCAT44(fVar167 * auVar97._4_4_,fVar158))));
  auVar111 = vpermps_avx2(auVar196,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  auVar102 = vmulps_avx512vl(auVar101,auVar104);
  auVar110._0_4_ = auVar101._0_4_ * auVar113._0_4_;
  auVar110._4_4_ = auVar101._4_4_ * auVar113._4_4_;
  auVar110._8_4_ = auVar101._8_4_ * auVar113._8_4_;
  auVar110._12_4_ = auVar101._12_4_ * auVar113._12_4_;
  auVar110._16_4_ = auVar101._16_4_ * auVar113._16_4_;
  auVar110._20_4_ = auVar101._20_4_ * auVar113._20_4_;
  auVar110._24_4_ = auVar101._24_4_ * auVar113._24_4_;
  auVar110._28_4_ = 0;
  auVar113._4_4_ = auVar101._4_4_ * auVar112._4_4_;
  auVar113._0_4_ = auVar101._0_4_ * auVar112._0_4_;
  auVar113._8_4_ = auVar101._8_4_ * auVar112._8_4_;
  auVar113._12_4_ = auVar101._12_4_ * auVar112._12_4_;
  auVar113._16_4_ = auVar101._16_4_ * auVar112._16_4_;
  auVar113._20_4_ = auVar101._20_4_ * auVar112._20_4_;
  auVar113._24_4_ = auVar101._24_4_ * auVar112._24_4_;
  auVar113._28_4_ = auVar104._28_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar111,auVar103);
  auVar92 = vfmadd231ps_fma(auVar110,auVar111,auVar114);
  auVar5 = vfmadd231ps_fma(auVar113,auVar111,auVar107);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar194,auVar105);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar194,auVar115);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar194,auVar106);
  auVar185._8_4_ = 0x7fffffff;
  auVar185._0_8_ = 0x7fffffff7fffffff;
  auVar185._12_4_ = 0x7fffffff;
  auVar185._16_4_ = 0x7fffffff;
  auVar185._20_4_ = 0x7fffffff;
  auVar185._24_4_ = 0x7fffffff;
  auVar185._28_4_ = 0x7fffffff;
  auVar105 = vandps_avx(ZEXT1632(auVar21),auVar185);
  auVar127._8_4_ = 0x219392ef;
  auVar127._0_8_ = 0x219392ef219392ef;
  auVar127._12_4_ = 0x219392ef;
  auVar127._16_4_ = 0x219392ef;
  auVar127._20_4_ = 0x219392ef;
  auVar127._24_4_ = 0x219392ef;
  auVar127._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar105,auVar127,1);
  bVar90 = (bool)((byte)uVar89 & 1);
  auVar102._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar21._0_4_;
  bVar90 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar21._4_4_;
  bVar90 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar21._8_4_;
  bVar90 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar21._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar95),auVar185);
  uVar89 = vcmpps_avx512vl(auVar105,auVar127,1);
  bVar90 = (bool)((byte)uVar89 & 1);
  auVar99._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._0_4_;
  bVar90 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._4_4_;
  bVar90 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._8_4_;
  bVar90 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar95._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar94),auVar185);
  uVar89 = vcmpps_avx512vl(auVar105,auVar127,1);
  bVar90 = (bool)((byte)uVar89 & 1);
  auVar105._0_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._0_4_;
  bVar90 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._4_4_;
  bVar90 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._8_4_;
  bVar90 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar90 * 0x219392ef | (uint)!bVar90 * auVar94._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = &DAT_3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar183._16_4_ = 0x3f800000;
  auVar183._20_4_ = 0x3f800000;
  auVar183._24_4_ = 0x3f800000;
  auVar183._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar102,auVar104,auVar183);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar99);
  auVar95 = vfnmadd213ps_fma(auVar99,auVar104,auVar183);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar105);
  auVar94 = vfnmadd213ps_fma(auVar105,auVar104,auVar183);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar104,auVar104);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar104 = vsubps_avx512vl(auVar105,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar106._4_4_ = auVar21._4_4_ * auVar104._4_4_;
  auVar106._0_4_ = auVar21._0_4_ * auVar104._0_4_;
  auVar106._8_4_ = auVar21._8_4_ * auVar104._8_4_;
  auVar106._12_4_ = auVar21._12_4_ * auVar104._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx512vl(auVar105,auVar103);
  auVar126._0_4_ = auVar21._0_4_ * auVar105._0_4_;
  auVar126._4_4_ = auVar21._4_4_ * auVar105._4_4_;
  auVar126._8_4_ = auVar21._8_4_ * auVar105._8_4_;
  auVar126._12_4_ = auVar21._12_4_ * auVar105._12_4_;
  auVar126._16_4_ = auVar105._16_4_ * 0.0;
  auVar126._20_4_ = auVar105._20_4_ * 0.0;
  auVar126._24_4_ = auVar105._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar83 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar92));
  auVar107._4_4_ = auVar95._4_4_ * auVar105._4_4_;
  auVar107._0_4_ = auVar95._0_4_ * auVar105._0_4_;
  auVar107._8_4_ = auVar95._8_4_ * auVar105._8_4_;
  auVar107._12_4_ = auVar95._12_4_ * auVar105._12_4_;
  auVar107._16_4_ = auVar105._16_4_ * 0.0;
  auVar107._20_4_ = auVar105._20_4_ * 0.0;
  auVar107._24_4_ = auVar105._24_4_ * 0.0;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar92));
  auVar109._0_4_ = auVar95._0_4_ * auVar105._0_4_;
  auVar109._4_4_ = auVar95._4_4_ * auVar105._4_4_;
  auVar109._8_4_ = auVar95._8_4_ * auVar105._8_4_;
  auVar109._12_4_ = auVar95._12_4_ * auVar105._12_4_;
  auVar109._16_4_ = auVar105._16_4_ * 0.0;
  auVar109._20_4_ = auVar105._20_4_ * 0.0;
  auVar109._24_4_ = auVar105._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar83 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar5));
  auVar112._4_4_ = auVar105._4_4_ * auVar94._4_4_;
  auVar112._0_4_ = auVar105._0_4_ * auVar94._0_4_;
  auVar112._8_4_ = auVar105._8_4_ * auVar94._8_4_;
  auVar112._12_4_ = auVar105._12_4_ * auVar94._12_4_;
  auVar112._16_4_ = auVar105._16_4_ * 0.0;
  auVar112._20_4_ = auVar105._20_4_ * 0.0;
  auVar112._24_4_ = auVar105._24_4_ * 0.0;
  auVar112._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar5));
  auVar100._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar100._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar100._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar100._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar100._16_4_ = auVar105._16_4_ * 0.0;
  auVar100._20_4_ = auVar105._20_4_ * 0.0;
  auVar100._24_4_ = auVar105._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar106,auVar126);
  auVar103 = vpminsd_avx2(auVar107,auVar109);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar112,auVar100);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar104._4_4_ = uVar147;
  auVar104._0_4_ = uVar147;
  auVar104._8_4_ = uVar147;
  auVar104._12_4_ = uVar147;
  auVar104._16_4_ = uVar147;
  auVar104._20_4_ = uVar147;
  auVar104._24_4_ = uVar147;
  auVar104._28_4_ = uVar147;
  auVar103 = vmaxps_avx512vl(auVar103,auVar104);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar105,auVar103);
  auVar184 = ZEXT3264(local_80);
  auVar105 = vpmaxsd_avx2(auVar106,auVar126);
  auVar157 = ZEXT3264(auVar105);
  auVar103 = vpmaxsd_avx2(auVar107,auVar109);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar112,auVar100);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar115._4_4_ = uVar147;
  auVar115._0_4_ = uVar147;
  auVar115._8_4_ = uVar147;
  auVar115._12_4_ = uVar147;
  auVar115._16_4_ = uVar147;
  auVar115._20_4_ = uVar147;
  auVar115._24_4_ = uVar147;
  auVar115._28_4_ = uVar147;
  auVar103 = vminps_avx512vl(auVar103,auVar115);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar114._8_4_ = 0x3f800003;
  auVar114._0_8_ = 0x3f8000033f800003;
  auVar114._12_4_ = 0x3f800003;
  auVar114._16_4_ = 0x3f800003;
  auVar114._20_4_ = 0x3f800003;
  auVar114._24_4_ = 0x3f800003;
  auVar114._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar114);
  auVar103 = vpbroadcastd_avx512vl();
  uVar22 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar148 = vcmpps_avx512vl(local_80,auVar105,2);
  bVar90 = (byte)((byte)uVar148 & (byte)uVar22) != 0;
  if (bVar90) {
    uVar89 = (ulong)(byte)((byte)uVar148 & (byte)uVar22);
    local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar103 = auVar184._0_32_;
      auVar105 = auVar157._0_32_;
      local_600 = in_ZMM21._0_32_;
      local_5e0 = in_ZMM20._0_32_;
      lVar87 = 0;
      for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar87 = lVar87 + 1;
      }
      uVar89 = uVar89 - 1 & uVar89;
      uVar83 = (ulong)(uint)((int)lVar87 << 6);
      uVar88 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar88].ptr;
      auVar21 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x16);
      if (uVar89 != 0) {
        uVar84 = uVar89 - 1 & uVar89;
        for (uVar85 = uVar89; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        }
        if (uVar84 != 0) {
          for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_550 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x26);
      local_560 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x36);
      local_570 = *(undefined1 (*) [16])(prim + uVar83 + lVar71 + 0x46);
      local_620._0_8_ = pGVar11;
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar92 = vsubps_avx512vl(auVar21,auVar95);
      uVar147 = auVar92._0_4_;
      auVar96._4_4_ = uVar147;
      auVar96._0_4_ = uVar147;
      auVar96._8_4_ = uVar147;
      auVar96._12_4_ = uVar147;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar167 = pre->ray_space[k].vz.field_0.m128[0];
      fVar146 = pre->ray_space[k].vz.field_0.m128[1];
      fVar174 = pre->ray_space[k].vz.field_0.m128[2];
      fVar175 = pre->ray_space[k].vz.field_0.m128[3];
      auVar98._0_4_ = fVar167 * auVar92._0_4_;
      auVar98._4_4_ = fVar146 * auVar92._4_4_;
      auVar98._8_4_ = fVar174 * auVar92._8_4_;
      auVar98._12_4_ = fVar175 * auVar92._12_4_;
      auVar94 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar94);
      auVar5 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar96);
      auVar93 = vshufps_avx512vl(auVar21,auVar21,0xff);
      auVar92 = vsubps_avx(local_550,auVar95);
      uVar147 = auVar92._0_4_;
      auVar160._4_4_ = uVar147;
      auVar160._0_4_ = uVar147;
      auVar160._8_4_ = uVar147;
      auVar160._12_4_ = uVar147;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar188._0_4_ = fVar167 * auVar92._0_4_;
      auVar188._4_4_ = fVar146 * auVar92._4_4_;
      auVar188._8_4_ = fVar174 * auVar92._8_4_;
      auVar188._12_4_ = fVar175 * auVar92._12_4_;
      auVar94 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar4,auVar94);
      auVar6 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar160);
      auVar92 = vsubps_avx512vl(local_560,auVar95);
      uVar147 = auVar92._0_4_;
      auVar161._4_4_ = uVar147;
      auVar161._0_4_ = uVar147;
      auVar161._8_4_ = uVar147;
      auVar161._12_4_ = uVar147;
      auVar94 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar190._0_4_ = fVar167 * auVar92._0_4_;
      auVar190._4_4_ = fVar146 * auVar92._4_4_;
      auVar190._8_4_ = fVar174 * auVar92._8_4_;
      auVar190._12_4_ = fVar175 * auVar92._12_4_;
      auVar94 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar4,auVar94);
      auVar92 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar161);
      auVar94 = vsubps_avx512vl(local_570,auVar95);
      uVar147 = auVar94._0_4_;
      auVar97._4_4_ = uVar147;
      auVar97._0_4_ = uVar147;
      auVar97._8_4_ = uVar147;
      auVar97._12_4_ = uVar147;
      auVar95 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar191._0_4_ = fVar167 * auVar94._0_4_;
      auVar191._4_4_ = fVar146 * auVar94._4_4_;
      auVar191._8_4_ = fVar174 * auVar94._8_4_;
      auVar191._12_4_ = fVar175 * auVar94._12_4_;
      auVar95 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar4,auVar95);
      auVar7 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar97);
      lVar70 = (long)iVar10 * 0x44;
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar70);
      uVar147 = auVar5._0_4_;
      local_5a0._4_4_ = uVar147;
      local_5a0._0_4_ = uVar147;
      local_5a0._8_4_ = uVar147;
      local_5a0._12_4_ = uVar147;
      local_5a0._16_4_ = uVar147;
      local_5a0._20_4_ = uVar147;
      local_5a0._24_4_ = uVar147;
      local_5a0._28_4_ = uVar147;
      auVar156._8_4_ = 1;
      auVar156._0_8_ = 0x100000001;
      auVar156._12_4_ = 1;
      auVar156._16_4_ = 1;
      auVar156._20_4_ = 1;
      auVar156._24_4_ = 1;
      auVar156._28_4_ = 1;
      local_5c0 = vpermps_avx512vl(auVar156,ZEXT1632(auVar5));
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x484);
      local_700 = vbroadcastss_avx512vl(auVar6);
      local_320 = vpermps_avx2(auVar156,ZEXT1632(auVar6));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar92);
      local_c0 = vpermps_avx512vl(auVar156,ZEXT1632(auVar92));
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0xd8c);
      local_640 = vbroadcastss_avx512vl(auVar7);
      auVar203 = ZEXT3264(local_640);
      local_660 = vpermps_avx512vl(auVar156,ZEXT1632(auVar7));
      auVar106 = vmulps_avx512vl(local_640,auVar113);
      auVar107 = vmulps_avx512vl(local_660,auVar113);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_700);
      auVar95 = vfmadd231ps_fma(auVar107,auVar115,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar106,auVar104,local_5a0);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar104,local_5c0);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar70);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x484);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x908);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0xd8c);
      auVar101 = vmulps_avx512vl(local_640,auVar111);
      auVar99 = vmulps_avx512vl(local_660,auVar111);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_700);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_320);
      auVar8 = vfmadd231ps_fma(auVar101,auVar106,local_5a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_5c0);
      local_720 = vsubps_avx512vl(ZEXT1632(auVar8),auVar102);
      _local_780 = vsubps_avx(auVar99,auVar108);
      auVar101 = vmulps_avx512vl(auVar108,local_720);
      auVar100 = vmulps_avx512vl(auVar102,_local_780);
      auVar101 = vsubps_avx512vl(auVar101,auVar100);
      auVar95 = vshufps_avx(local_550,local_550,0xff);
      uVar148 = auVar93._0_8_;
      local_e0._8_8_ = uVar148;
      local_e0._0_8_ = uVar148;
      local_e0._16_8_ = uVar148;
      local_e0._24_8_ = uVar148;
      local_100 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(local_560,local_560,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(local_570,local_570,0xff);
      uVar148 = auVar95._0_8_;
      register0x00001248 = uVar148;
      local_140 = uVar148;
      register0x00001250 = uVar148;
      register0x00001258 = uVar148;
      auVar100 = vmulps_avx512vl(_local_140,auVar113);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar114,local_120);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,local_100);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_e0);
      auVar109 = vmulps_avx512vl(_local_140,auVar111);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_120);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,local_100);
      auVar93 = vfmadd231ps_fma(auVar109,auVar106,local_e0);
      auVar109 = vmulps_avx512vl(_local_780,_local_780);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_720,local_720);
      auVar110 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar93));
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      auVar109 = vmulps_avx512vl(auVar110,auVar109);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar148 = vcmpps_avx512vl(auVar101,auVar109,2);
      auVar95 = vblendps_avx(auVar5,auVar21,8);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vblendps_avx(auVar6,local_550,8);
      auVar95 = vandps_avx512vl(auVar95,auVar96);
      auVar94 = vmaxps_avx(auVar94,auVar95);
      auVar95 = vblendps_avx(auVar92,local_560,8);
      auVar97 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vblendps_avx(auVar7,local_570,8);
      auVar95 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vmaxps_avx(auVar97,auVar95);
      auVar95 = vmaxps_avx(auVar94,auVar95);
      auVar94 = vmovshdup_avx(auVar95);
      auVar94 = vmaxss_avx(auVar94,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar94);
      auVar94 = vcvtsi2ss_avx512f(local_570,iVar10);
      local_4c0._0_16_ = auVar94;
      auVar192._0_4_ = auVar94._0_4_;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar192._16_4_ = auVar192._0_4_;
      auVar192._20_4_ = auVar192._0_4_;
      auVar192._24_4_ = auVar192._0_4_;
      auVar192._28_4_ = auVar192._0_4_;
      uVar22 = vcmpps_avx512vl(auVar192,_DAT_02020f40,0xe);
      local_3f0 = (byte)uVar148 & (byte)uVar22;
      local_680 = auVar95._0_4_ * 4.7683716e-07;
      auVar164._8_4_ = 2;
      auVar164._0_8_ = 0x200000002;
      auVar164._12_4_ = 2;
      auVar164._16_4_ = 2;
      auVar164._20_4_ = 2;
      auVar164._24_4_ = 2;
      auVar164._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar164,ZEXT1632(auVar5));
      local_180 = vpermps_avx512vl(auVar164,ZEXT1632(auVar6));
      local_1a0 = vpermps_avx512vl(auVar164,ZEXT1632(auVar92));
      auVar101 = vpermps_avx2(auVar164,ZEXT1632(auVar7));
      fVar167 = *(float *)(ray + k * 4 + 0x60);
      local_750 = ZEXT416((uint)local_680);
      if (local_3f0 == 0) {
        uVar83 = 0;
        auVar95 = vxorps_avx512vl(auVar21,auVar21);
        auVar202 = ZEXT1664(auVar95);
        auVar184 = ZEXT3264(auVar103);
        in_ZMM20 = ZEXT3264(local_5e0);
        auVar157 = ZEXT3264(auVar105);
        in_ZMM21 = ZEXT3264(local_600);
        auVar201 = ZEXT3264(local_5a0);
        auVar200 = ZEXT3264(local_5c0);
        auVar199 = ZEXT3264(local_700);
        auVar204 = ZEXT3264(local_660);
      }
      else {
        fStack_67c = 0.0;
        fStack_678 = 0.0;
        fStack_674 = 0.0;
        auVar111 = vmulps_avx512vl(auVar101,auVar111);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar112);
        auVar107 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
        auVar113 = vmulps_avx512vl(auVar101,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar104,local_160,auVar112);
        auVar104 = vmulps_avx512vl(local_640,auVar106);
        auVar111 = vmulps_avx512vl(local_660,auVar106);
        auVar32._4_4_ = auVar101._4_4_ * auVar106._4_4_;
        auVar32._0_4_ = auVar101._0_4_ * auVar106._0_4_;
        auVar32._8_4_ = auVar101._8_4_ * auVar106._8_4_;
        auVar32._12_4_ = auVar101._12_4_ * auVar106._12_4_;
        auVar32._16_4_ = auVar101._16_4_ * auVar106._16_4_;
        auVar32._20_4_ = auVar101._20_4_ * auVar106._20_4_;
        auVar32._24_4_ = auVar101._24_4_ * auVar106._24_4_;
        auVar32._28_4_ = auVar106._28_4_;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
        auVar106 = vfmadd231ps_avx512vl(auVar111,auVar113,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar32,local_1a0,auVar113);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_700);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_320);
        auVar111 = vfmadd231ps_avx512vl(auVar113,local_180,auVar114);
        auVar109 = vfmadd231ps_avx512vl(auVar104,auVar115,local_5a0);
        auVar200 = ZEXT3264(local_5c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_5c0);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1f9c);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_160,auVar115);
        auVar115 = vmulps_avx512vl(local_640,auVar113);
        auVar110 = vmulps_avx512vl(local_660,auVar113);
        auVar33._4_4_ = auVar101._4_4_ * auVar113._4_4_;
        auVar33._0_4_ = auVar101._0_4_ * auVar113._0_4_;
        auVar33._8_4_ = auVar101._8_4_ * auVar113._8_4_;
        auVar33._12_4_ = auVar101._12_4_ * auVar113._12_4_;
        auVar33._16_4_ = auVar101._16_4_ * auVar113._16_4_;
        auVar33._20_4_ = auVar101._20_4_ * auVar113._20_4_;
        auVar33._24_4_ = auVar101._24_4_ * auVar113._24_4_;
        auVar33._28_4_ = auVar113._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar115,auVar114,local_a0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_c0);
        auVar114 = vfmadd231ps_avx512vl(auVar33,local_1a0,auVar114);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_700);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_320);
        auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar104,local_5a0);
        auVar113 = vfmadd231ps_avx512vl(auVar110,auVar104,local_5c0);
        auVar110 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
        auVar197._8_4_ = 0x7fffffff;
        auVar197._0_8_ = 0x7fffffff7fffffff;
        auVar197._12_4_ = 0x7fffffff;
        auVar197._16_4_ = 0x7fffffff;
        auVar197._20_4_ = 0x7fffffff;
        auVar197._24_4_ = 0x7fffffff;
        auVar197._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar109,auVar197);
        auVar115 = vandps_avx(auVar106,auVar197);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar111,auVar197);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        auVar111 = vbroadcastss_avx512vl(local_750);
        uVar83 = vcmpps_avx512vl(auVar104,auVar111,1);
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar116._0_4_ = (float)((uint)bVar13 * local_720._0_4_ | (uint)!bVar13 * auVar109._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar13 * local_720._4_4_ | (uint)!bVar13 * auVar109._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar13 * local_720._8_4_ | (uint)!bVar13 * auVar109._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar13 * local_720._12_4_ | (uint)!bVar13 * auVar109._12_4_)
        ;
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar13 * local_720._16_4_ | (uint)!bVar13 * auVar109._16_4_)
        ;
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar13 * local_720._20_4_ | (uint)!bVar13 * auVar109._20_4_)
        ;
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar13 * local_720._24_4_ | (uint)!bVar13 * auVar109._24_4_)
        ;
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar116._28_4_ = (uint)bVar13 * local_720._28_4_ | (uint)!bVar13 * auVar109._28_4_;
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar117._0_4_ = (float)((uint)bVar13 * local_780._0_4_ | (uint)!bVar13 * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar13 * local_780._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar13 * iStack_778 | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar13 * iStack_774 | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar13 * iStack_770 | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar13 * iStack_76c | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar13 * iStack_768 | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar117._28_4_ = (uint)bVar13 * iStack_764 | (uint)!bVar13 * auVar106._28_4_;
        auVar104 = vandps_avx(auVar197,auVar114);
        auVar115 = vandps_avx(auVar113,auVar197);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar110,auVar197);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        uVar83 = vcmpps_avx512vl(auVar104,auVar111,1);
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar118._0_4_ = (float)((uint)bVar13 * local_720._0_4_ | (uint)!bVar13 * auVar114._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * local_720._4_4_ | (uint)!bVar13 * auVar114._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * local_720._8_4_ | (uint)!bVar13 * auVar114._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * local_720._12_4_ | (uint)!bVar13 * auVar114._12_4_)
        ;
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar13 * local_720._16_4_ | (uint)!bVar13 * auVar114._16_4_)
        ;
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar13 * local_720._20_4_ | (uint)!bVar13 * auVar114._20_4_)
        ;
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar13 * local_720._24_4_ | (uint)!bVar13 * auVar114._24_4_)
        ;
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar118._28_4_ = (uint)bVar13 * local_720._28_4_ | (uint)!bVar13 * auVar114._28_4_;
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar119._0_4_ = (float)((uint)bVar13 * local_780._0_4_ | (uint)!bVar13 * auVar113._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * local_780._4_4_ | (uint)!bVar13 * auVar113._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * iStack_778 | (uint)!bVar13 * auVar113._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * iStack_774 | (uint)!bVar13 * auVar113._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar13 * iStack_770 | (uint)!bVar13 * auVar113._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar13 * iStack_76c | (uint)!bVar13 * auVar113._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar13 * iStack_768 | (uint)!bVar13 * auVar113._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar119._28_4_ = (uint)bVar13 * iStack_764 | (uint)!bVar13 * auVar113._28_4_;
        auVar98 = vxorps_avx512vl(auVar21,auVar21);
        auVar202 = ZEXT1664(auVar98);
        auVar104 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar98));
        auVar95 = vfmadd231ps_fma(auVar104,auVar117,auVar117);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar146 = auVar104._0_4_;
        fVar174 = auVar104._4_4_;
        fVar175 = auVar104._8_4_;
        fVar176 = auVar104._12_4_;
        fVar159 = auVar104._16_4_;
        fVar166 = auVar104._20_4_;
        fVar91 = auVar104._24_4_;
        auVar34._4_4_ = fVar174 * fVar174 * fVar174 * auVar95._4_4_ * -0.5;
        auVar34._0_4_ = fVar146 * fVar146 * fVar146 * auVar95._0_4_ * -0.5;
        auVar34._8_4_ = fVar175 * fVar175 * fVar175 * auVar95._8_4_ * -0.5;
        auVar34._12_4_ = fVar176 * fVar176 * fVar176 * auVar95._12_4_ * -0.5;
        auVar34._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar34._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar34._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar34._28_4_ = 0;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar34,auVar115,auVar104);
        auVar35._4_4_ = auVar117._4_4_ * auVar114._4_4_;
        auVar35._0_4_ = auVar117._0_4_ * auVar114._0_4_;
        auVar35._8_4_ = auVar117._8_4_ * auVar114._8_4_;
        auVar35._12_4_ = auVar117._12_4_ * auVar114._12_4_;
        auVar35._16_4_ = auVar117._16_4_ * auVar114._16_4_;
        auVar35._20_4_ = auVar117._20_4_ * auVar114._20_4_;
        auVar35._24_4_ = auVar117._24_4_ * auVar114._24_4_;
        auVar35._28_4_ = auVar104._28_4_;
        auVar36._4_4_ = auVar114._4_4_ * -auVar116._4_4_;
        auVar36._0_4_ = auVar114._0_4_ * -auVar116._0_4_;
        auVar36._8_4_ = auVar114._8_4_ * -auVar116._8_4_;
        auVar36._12_4_ = auVar114._12_4_ * -auVar116._12_4_;
        auVar36._16_4_ = auVar114._16_4_ * -auVar116._16_4_;
        auVar36._20_4_ = auVar114._20_4_ * -auVar116._20_4_;
        auVar36._24_4_ = auVar114._24_4_ * -auVar116._24_4_;
        auVar36._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar114,ZEXT1632(auVar98));
        auVar109 = ZEXT1632(auVar98);
        auVar113 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar109);
        auVar95 = vfmadd231ps_fma(auVar113,auVar119,auVar119);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar146 = auVar113._0_4_;
        fVar174 = auVar113._4_4_;
        fVar175 = auVar113._8_4_;
        fVar176 = auVar113._12_4_;
        fVar159 = auVar113._16_4_;
        fVar166 = auVar113._20_4_;
        fVar91 = auVar113._24_4_;
        auVar37._4_4_ = fVar174 * fVar174 * fVar174 * auVar95._4_4_ * -0.5;
        auVar37._0_4_ = fVar146 * fVar146 * fVar146 * auVar95._0_4_ * -0.5;
        auVar37._8_4_ = fVar175 * fVar175 * fVar175 * auVar95._8_4_ * -0.5;
        auVar37._12_4_ = fVar176 * fVar176 * fVar176 * auVar95._12_4_ * -0.5;
        auVar37._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar37._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar37._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar37._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar37,auVar115,auVar113);
        auVar38._4_4_ = auVar119._4_4_ * auVar115._4_4_;
        auVar38._0_4_ = auVar119._0_4_ * auVar115._0_4_;
        auVar38._8_4_ = auVar119._8_4_ * auVar115._8_4_;
        auVar38._12_4_ = auVar119._12_4_ * auVar115._12_4_;
        auVar38._16_4_ = auVar119._16_4_ * auVar115._16_4_;
        auVar38._20_4_ = auVar119._20_4_ * auVar115._20_4_;
        auVar38._24_4_ = auVar119._24_4_ * auVar115._24_4_;
        auVar38._28_4_ = auVar113._28_4_;
        auVar39._4_4_ = -auVar118._4_4_ * auVar115._4_4_;
        auVar39._0_4_ = -auVar118._0_4_ * auVar115._0_4_;
        auVar39._8_4_ = -auVar118._8_4_ * auVar115._8_4_;
        auVar39._12_4_ = -auVar118._12_4_ * auVar115._12_4_;
        auVar39._16_4_ = -auVar118._16_4_ * auVar115._16_4_;
        auVar39._20_4_ = -auVar118._20_4_ * auVar115._20_4_;
        auVar39._24_4_ = -auVar118._24_4_ * auVar115._24_4_;
        auVar39._28_4_ = auVar114._28_4_;
        auVar115 = vmulps_avx512vl(auVar115,auVar109);
        auVar95 = vfmadd213ps_fma(auVar35,auVar100,auVar102);
        auVar94 = vfmadd213ps_fma(auVar36,auVar100,auVar108);
        auVar114 = vfmadd213ps_avx512vl(auVar104,auVar100,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar93),ZEXT1632(auVar8));
        auVar96 = vfnmadd213ps_fma(auVar35,auVar100,auVar102);
        auVar111 = ZEXT1632(auVar93);
        auVar92 = vfmadd213ps_fma(auVar39,auVar111,auVar99);
        auVar97 = vfnmadd213ps_fma(auVar36,auVar100,auVar108);
        auVar5 = vfmadd213ps_fma(auVar115,auVar111,auVar107);
        auVar106 = vfnmadd231ps_avx512vl(auVar112,auVar100,auVar104);
        auVar8 = vfnmadd213ps_fma(auVar38,auVar111,ZEXT1632(auVar8));
        auVar160 = vfnmadd213ps_fma(auVar39,auVar111,auVar99);
        auVar161 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar93),auVar115);
        auVar115 = vsubps_avx512vl(auVar113,ZEXT1632(auVar96));
        auVar104 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar97));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar5),auVar106);
        auVar112 = vmulps_avx512vl(auVar104,auVar106);
        auVar6 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar97),auVar107);
        auVar40._4_4_ = auVar96._4_4_ * auVar107._4_4_;
        auVar40._0_4_ = auVar96._0_4_ * auVar107._0_4_;
        auVar40._8_4_ = auVar96._8_4_ * auVar107._8_4_;
        auVar40._12_4_ = auVar96._12_4_ * auVar107._12_4_;
        auVar40._16_4_ = auVar107._16_4_ * 0.0;
        auVar40._20_4_ = auVar107._20_4_ * 0.0;
        auVar40._24_4_ = auVar107._24_4_ * 0.0;
        auVar40._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar40,auVar106,auVar115);
        auVar41._4_4_ = auVar97._4_4_ * auVar115._4_4_;
        auVar41._0_4_ = auVar97._0_4_ * auVar115._0_4_;
        auVar41._8_4_ = auVar97._8_4_ * auVar115._8_4_;
        auVar41._12_4_ = auVar97._12_4_ * auVar115._12_4_;
        auVar41._16_4_ = auVar115._16_4_ * 0.0;
        auVar41._20_4_ = auVar115._20_4_ * 0.0;
        auVar41._24_4_ = auVar115._24_4_ * 0.0;
        auVar41._28_4_ = auVar115._28_4_;
        auVar7 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar96),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar109,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar6));
        auVar109 = ZEXT1632(auVar98);
        uVar83 = vcmpps_avx512vl(auVar104,auVar109,2);
        bVar86 = (byte)uVar83;
        fVar91 = (float)((uint)(bVar86 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar8._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar138 = (float)((uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar8._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar140 = (float)((uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar8._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar142 = (float)((uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar8._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar91))));
        fVar158 = (float)((uint)(bVar86 & 1) * auVar94._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * auVar160._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar139 = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar160._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar141 = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar160._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar143 = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar160._12_4_);
        auVar111 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar158))));
        auVar120._0_4_ =
             (float)((uint)(bVar86 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar86 & 1) * auVar161._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar161._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar161._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar161._12_4_);
        fVar146 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_);
        auVar120._16_4_ = fVar146;
        fVar174 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_);
        auVar120._20_4_ = fVar174;
        fVar175 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_);
        auVar120._24_4_ = fVar175;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar114._28_4_;
        auVar120._28_4_ = iVar1;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar113);
        auVar121._0_4_ =
             (uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar6._0_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar6._4_4_;
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar6._8_4_;
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar6._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar92));
        auVar122._0_4_ =
             (float)((uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar94._0_4_
                    );
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar94._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar94._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar94._12_4_);
        fVar176 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
        auVar122._16_4_ = fVar176;
        fVar159 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
        auVar122._20_4_ = fVar159;
        fVar166 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
        auVar122._24_4_ = fVar166;
        auVar122._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar5));
        auVar123._0_4_ =
             (float)((uint)(bVar86 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar86 & 1) * auVar114._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar114._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar114._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar114._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar114._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar114._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar114._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar114._28_4_;
        auVar124._0_4_ =
             (uint)(bVar86 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar113._0_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar13 * (int)auVar96._4_4_ | (uint)!bVar13 * auVar113._4_4_;
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar13 * (int)auVar96._8_4_ | (uint)!bVar13 * auVar113._8_4_;
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar13 * (int)auVar96._12_4_ | (uint)!bVar13 * auVar113._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar113._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar113._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar113._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar113._28_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar86 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar5._0_4_;
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar5._4_4_;
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar5._8_4_;
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar5._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar106._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar106._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar106._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar106._28_4_;
        auVar125._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar124,auVar112);
        auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar97._12_4_ |
                                                 (uint)!bVar16 * auVar92._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar97._8_4_ |
                                                          (uint)!bVar15 * auVar92._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar97._4_4_
                                                                   | (uint)!bVar13 * auVar92._4_4_,
                                                                   (uint)(bVar86 & 1) *
                                                                   (int)auVar97._0_4_ |
                                                                   (uint)!(bool)(bVar86 & 1) *
                                                                   auVar92._0_4_)))),auVar111);
        auVar114 = vsubps_avx(auVar125,auVar120);
        auVar113 = vsubps_avx(auVar112,auVar121);
        auVar106 = vsubps_avx(auVar111,auVar122);
        auVar107 = vsubps_avx(auVar120,auVar123);
        auVar42._4_4_ = auVar114._4_4_ * fVar138;
        auVar42._0_4_ = auVar114._0_4_ * fVar91;
        auVar42._8_4_ = auVar114._8_4_ * fVar140;
        auVar42._12_4_ = auVar114._12_4_ * fVar142;
        auVar42._16_4_ = auVar114._16_4_ * 0.0;
        auVar42._20_4_ = auVar114._20_4_ * 0.0;
        auVar42._24_4_ = auVar114._24_4_ * 0.0;
        auVar42._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar42,auVar120,auVar102);
        auVar43._4_4_ = fVar139 * auVar102._4_4_;
        auVar43._0_4_ = fVar158 * auVar102._0_4_;
        auVar43._8_4_ = fVar141 * auVar102._8_4_;
        auVar43._12_4_ = fVar143 * auVar102._12_4_;
        auVar43._16_4_ = auVar102._16_4_ * 0.0;
        auVar43._20_4_ = auVar102._20_4_ * 0.0;
        auVar43._24_4_ = auVar102._24_4_ * 0.0;
        auVar43._28_4_ = auVar104._28_4_;
        auVar94 = vfmsub231ps_fma(auVar43,auVar112,auVar115);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar109,ZEXT1632(auVar95));
        auVar168._0_4_ = auVar115._0_4_ * auVar120._0_4_;
        auVar168._4_4_ = auVar115._4_4_ * auVar120._4_4_;
        auVar168._8_4_ = auVar115._8_4_ * auVar120._8_4_;
        auVar168._12_4_ = auVar115._12_4_ * auVar120._12_4_;
        auVar168._16_4_ = auVar115._16_4_ * fVar146;
        auVar168._20_4_ = auVar115._20_4_ * fVar174;
        auVar168._24_4_ = auVar115._24_4_ * fVar175;
        auVar168._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar168,auVar111,auVar114);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar95));
        auVar104 = vmulps_avx512vl(auVar107,auVar121);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar123);
        auVar44._4_4_ = auVar106._4_4_ * auVar123._4_4_;
        auVar44._0_4_ = auVar106._0_4_ * auVar123._0_4_;
        auVar44._8_4_ = auVar106._8_4_ * auVar123._8_4_;
        auVar44._12_4_ = auVar106._12_4_ * auVar123._12_4_;
        auVar44._16_4_ = auVar106._16_4_ * auVar123._16_4_;
        auVar44._20_4_ = auVar106._20_4_ * auVar123._20_4_;
        auVar44._24_4_ = auVar106._24_4_ * auVar123._24_4_;
        auVar44._28_4_ = auVar123._28_4_;
        auVar95 = vfmsub231ps_fma(auVar44,auVar122,auVar107);
        auVar169._0_4_ = auVar122._0_4_ * auVar113._0_4_;
        auVar169._4_4_ = auVar122._4_4_ * auVar113._4_4_;
        auVar169._8_4_ = auVar122._8_4_ * auVar113._8_4_;
        auVar169._12_4_ = auVar122._12_4_ * auVar113._12_4_;
        auVar169._16_4_ = fVar176 * auVar113._16_4_;
        auVar169._20_4_ = fVar159 * auVar113._20_4_;
        auVar169._24_4_ = fVar166 * auVar113._24_4_;
        auVar169._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar169,auVar106,auVar121);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar109,auVar104);
        auVar99 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar95));
        auVar104 = vmaxps_avx(auVar108,auVar99);
        uVar148 = vcmpps_avx512vl(auVar104,auVar109,2);
        local_3f0 = local_3f0 & (byte)uVar148;
        in_ZMM20 = ZEXT3264(local_5e0);
        in_ZMM21 = ZEXT3264(local_600);
        auVar201 = ZEXT3264(local_5a0);
        auVar199 = ZEXT3264(local_700);
        auVar195 = ZEXT1664(local_750);
        if (local_3f0 == 0) {
          local_3f0 = 0;
          auVar184 = ZEXT3264(auVar103);
          auVar157 = ZEXT3264(auVar105);
        }
        else {
          auVar45._4_4_ = auVar107._4_4_ * auVar115._4_4_;
          auVar45._0_4_ = auVar107._0_4_ * auVar115._0_4_;
          auVar45._8_4_ = auVar107._8_4_ * auVar115._8_4_;
          auVar45._12_4_ = auVar107._12_4_ * auVar115._12_4_;
          auVar45._16_4_ = auVar107._16_4_ * auVar115._16_4_;
          auVar45._20_4_ = auVar107._20_4_ * auVar115._20_4_;
          auVar45._24_4_ = auVar107._24_4_ * auVar115._24_4_;
          auVar45._28_4_ = auVar104._28_4_;
          auVar92 = vfmsub231ps_fma(auVar45,auVar106,auVar114);
          auVar46._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar46._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar46._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar46._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar46._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar46._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar46._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar46._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar46,auVar102,auVar107);
          auVar47._4_4_ = auVar106._4_4_ * auVar102._4_4_;
          auVar47._0_4_ = auVar106._0_4_ * auVar102._0_4_;
          auVar47._8_4_ = auVar106._8_4_ * auVar102._8_4_;
          auVar47._12_4_ = auVar106._12_4_ * auVar102._12_4_;
          auVar47._16_4_ = auVar106._16_4_ * auVar102._16_4_;
          auVar47._20_4_ = auVar106._20_4_ * auVar102._20_4_;
          auVar47._24_4_ = auVar106._24_4_ * auVar102._24_4_;
          auVar47._28_4_ = auVar106._28_4_;
          auVar5 = vfmsub231ps_fma(auVar47,auVar113,auVar115);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar5));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar92),auVar109);
          auVar115 = vrcp14ps_avx512vl(auVar104);
          auVar23._8_4_ = 0x3f800000;
          auVar23._0_8_ = &DAT_3f8000003f800000;
          auVar23._12_4_ = 0x3f800000;
          auVar23._16_4_ = 0x3f800000;
          auVar23._20_4_ = 0x3f800000;
          auVar23._24_4_ = 0x3f800000;
          auVar23._28_4_ = 0x3f800000;
          auVar114 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar23);
          auVar95 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
          auVar48._4_4_ = auVar5._4_4_ * auVar120._4_4_;
          auVar48._0_4_ = auVar5._0_4_ * auVar120._0_4_;
          auVar48._8_4_ = auVar5._8_4_ * auVar120._8_4_;
          auVar48._12_4_ = auVar5._12_4_ * auVar120._12_4_;
          auVar48._16_4_ = fVar146 * 0.0;
          auVar48._20_4_ = fVar174 * 0.0;
          auVar48._24_4_ = fVar175 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar48,auVar111,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,ZEXT1632(auVar92));
          fVar146 = auVar95._0_4_;
          fVar174 = auVar95._4_4_;
          fVar175 = auVar95._8_4_;
          fVar176 = auVar95._12_4_;
          auVar115 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar176,
                                        CONCAT48(auVar94._8_4_ * fVar175,
                                                 CONCAT44(auVar94._4_4_ * fVar174,
                                                          auVar94._0_4_ * fVar146))));
          auVar157 = ZEXT3264(auVar115);
          auVar186._4_4_ = fVar167;
          auVar186._0_4_ = fVar167;
          auVar186._8_4_ = fVar167;
          auVar186._12_4_ = fVar167;
          auVar186._16_4_ = fVar167;
          auVar186._20_4_ = fVar167;
          auVar186._24_4_ = fVar167;
          auVar186._28_4_ = fVar167;
          uVar148 = vcmpps_avx512vl(auVar186,auVar115,2);
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar24._4_4_ = uVar147;
          auVar24._0_4_ = uVar147;
          auVar24._8_4_ = uVar147;
          auVar24._12_4_ = uVar147;
          auVar24._16_4_ = uVar147;
          auVar24._20_4_ = uVar147;
          auVar24._24_4_ = uVar147;
          auVar24._28_4_ = uVar147;
          uVar22 = vcmpps_avx512vl(auVar115,auVar24,2);
          local_3f0 = (byte)uVar148 & (byte)uVar22 & local_3f0;
          if (local_3f0 == 0) {
            local_3f0 = 0;
            auVar184 = ZEXT3264(auVar103);
            auVar157 = ZEXT3264(auVar105);
          }
          else {
            uVar148 = vcmpps_avx512vl(auVar104,auVar109,4);
            if ((local_3f0 & (byte)uVar148) == 0) {
              local_3f0 = 0;
              auVar184 = ZEXT3264(auVar103);
              auVar157 = ZEXT3264(auVar105);
            }
            else {
              local_3f0 = local_3f0 & (byte)uVar148;
              fVar159 = auVar108._0_4_ * fVar146;
              fVar166 = auVar108._4_4_ * fVar174;
              auVar49._4_4_ = fVar166;
              auVar49._0_4_ = fVar159;
              fVar91 = auVar108._8_4_ * fVar175;
              auVar49._8_4_ = fVar91;
              fVar158 = auVar108._12_4_ * fVar176;
              auVar49._12_4_ = fVar158;
              fVar138 = auVar108._16_4_ * 0.0;
              auVar49._16_4_ = fVar138;
              fVar139 = auVar108._20_4_ * 0.0;
              auVar49._20_4_ = fVar139;
              fVar140 = auVar108._24_4_ * 0.0;
              auVar49._24_4_ = fVar140;
              auVar49._28_4_ = auVar108._28_4_;
              fVar146 = auVar99._0_4_ * fVar146;
              fVar174 = auVar99._4_4_ * fVar174;
              auVar50._4_4_ = fVar174;
              auVar50._0_4_ = fVar146;
              fVar175 = auVar99._8_4_ * fVar175;
              auVar50._8_4_ = fVar175;
              fVar176 = auVar99._12_4_ * fVar176;
              auVar50._12_4_ = fVar176;
              fVar141 = auVar99._16_4_ * 0.0;
              auVar50._16_4_ = fVar141;
              fVar142 = auVar99._20_4_ * 0.0;
              auVar50._20_4_ = fVar142;
              fVar143 = auVar99._24_4_ * 0.0;
              auVar50._24_4_ = fVar143;
              auVar50._28_4_ = auVar99._28_4_;
              auVar179._8_4_ = 0x3f800000;
              auVar179._0_8_ = &DAT_3f8000003f800000;
              auVar179._12_4_ = 0x3f800000;
              auVar179._16_4_ = 0x3f800000;
              auVar179._20_4_ = 0x3f800000;
              auVar179._24_4_ = 0x3f800000;
              auVar179._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar179,auVar49);
              bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar19 = SUB81(uVar83 >> 7,0);
              auVar184 = ZEXT3264(CONCAT428((uint)bVar19 * auVar108._28_4_ |
                                            (uint)!bVar19 * auVar105._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar140 |
                                                      (uint)!bVar18 * auVar105._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar139 |
                                                                (uint)!bVar17 * auVar105._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar138 |
                                                                          (uint)!bVar16 *
                                                                          auVar105._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar158 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar105._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar91 |
                                                  (uint)!bVar14 * auVar105._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar166 |
                                                           (uint)!bVar13 * auVar105._4_4_,
                                                           (uint)(bVar86 & 1) * (int)fVar159 |
                                                           (uint)!(bool)(bVar86 & 1) *
                                                           auVar105._0_4_))))))));
              auVar105 = vsubps_avx(auVar179,auVar50);
              bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar19 = SUB81(uVar83 >> 7,0);
              local_340._4_4_ = (uint)bVar13 * (int)fVar174 | (uint)!bVar13 * auVar105._4_4_;
              local_340._0_4_ =
                   (uint)(bVar86 & 1) * (int)fVar146 | (uint)!(bool)(bVar86 & 1) * auVar105._0_4_;
              local_340._8_4_ = (uint)bVar14 * (int)fVar175 | (uint)!bVar14 * auVar105._8_4_;
              local_340._12_4_ = (uint)bVar15 * (int)fVar176 | (uint)!bVar15 * auVar105._12_4_;
              local_340._16_4_ = (uint)bVar16 * (int)fVar141 | (uint)!bVar16 * auVar105._16_4_;
              local_340._20_4_ = (uint)bVar17 * (int)fVar142 | (uint)!bVar17 * auVar105._20_4_;
              local_340._24_4_ = (uint)bVar18 * (int)fVar143 | (uint)!bVar18 * auVar105._24_4_;
              local_340._28_4_ = (uint)bVar19 * auVar99._28_4_ | (uint)!bVar19 * auVar105._28_4_;
            }
          }
        }
        auVar204 = ZEXT3264(local_660);
        auVar203 = ZEXT3264(local_640);
        auVar187 = ZEXT3264(auVar101);
        if (local_3f0 == 0) {
          uVar83 = 0;
        }
        else {
          auVar105 = vsubps_avx(ZEXT1632(auVar93),auVar100);
          auVar104 = auVar184._0_32_;
          auVar95 = vfmadd213ps_fma(auVar105,auVar104,auVar100);
          uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar25._4_4_ = uVar147;
          auVar25._0_4_ = uVar147;
          auVar25._8_4_ = uVar147;
          auVar25._12_4_ = uVar147;
          auVar25._16_4_ = uVar147;
          auVar25._20_4_ = uVar147;
          auVar25._24_4_ = uVar147;
          auVar25._28_4_ = uVar147;
          auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                        CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                 CONCAT44(auVar95._4_4_ +
                                                                          auVar95._4_4_,
                                                                          auVar95._0_4_ +
                                                                          auVar95._0_4_)))),auVar25)
          ;
          auVar103 = auVar157._0_32_;
          uVar148 = vcmpps_avx512vl(auVar103,auVar105,6);
          local_3f0 = local_3f0 & (byte)uVar148;
          if (local_3f0 == 0) {
            uVar83 = 0;
          }
          else {
            local_780._0_4_ = *(undefined4 *)(prim + lVar87 * 4 + 6);
            auVar153._8_4_ = 0xbf800000;
            auVar153._0_8_ = 0xbf800000bf800000;
            auVar153._12_4_ = 0xbf800000;
            auVar153._16_4_ = 0xbf800000;
            auVar153._20_4_ = 0xbf800000;
            auVar153._24_4_ = 0xbf800000;
            auVar153._28_4_ = 0xbf800000;
            auVar26._8_4_ = 0x40000000;
            auVar26._0_8_ = 0x4000000040000000;
            auVar26._12_4_ = 0x40000000;
            auVar26._16_4_ = 0x40000000;
            auVar26._20_4_ = 0x40000000;
            auVar26._24_4_ = 0x40000000;
            auVar26._28_4_ = 0x40000000;
            local_480 = vfmadd132ps_avx512vl(local_340,auVar153,auVar26);
            local_340 = local_480;
            auVar105 = local_340;
            local_440 = 0;
            local_420 = local_550._0_8_;
            uStack_418 = local_550._8_8_;
            local_410 = local_560._0_8_;
            uStack_408 = local_560._8_8_;
            local_400 = local_570._0_8_;
            uStack_3f8 = local_570._8_8_;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              uVar83 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar83 = CONCAT71((int7)((ulong)pGVar11 >> 8),1),
                    pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar146 = 1.0 / auVar192._0_4_;
              local_3e0[0] = fVar146 * (auVar184._0_4_ + 0.0);
              local_3e0[1] = fVar146 * (auVar184._4_4_ + 1.0);
              local_3e0[2] = fVar146 * (auVar184._8_4_ + 2.0);
              local_3e0[3] = fVar146 * (auVar184._12_4_ + 3.0);
              fStack_3d0 = fVar146 * (auVar184._16_4_ + 4.0);
              fStack_3cc = fVar146 * (auVar184._20_4_ + 5.0);
              fStack_3c8 = fVar146 * (auVar184._24_4_ + 6.0);
              fStack_3c4 = auVar184._28_4_ + 7.0;
              local_340._0_8_ = local_480._0_8_;
              local_340._8_8_ = local_480._8_8_;
              local_340._16_8_ = local_480._16_8_;
              local_340._24_8_ = local_480._24_8_;
              local_3c0 = local_340._0_8_;
              uStack_3b8 = local_340._8_8_;
              uStack_3b0 = local_340._16_8_;
              uStack_3a8 = local_340._24_8_;
              local_3a0 = auVar103;
              lVar87 = 0;
              uVar85 = (ulong)local_3f0;
              for (uVar83 = uVar85; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
                lVar87 = lVar87 + 1;
              }
              local_520 = vpbroadcastd_avx512vl();
              local_730 = local_550._0_8_;
              uStack_728 = local_550._8_8_;
              local_540 = vpbroadcastd_avx512vl();
              local_740 = local_560._0_4_;
              uStack_73c = local_560._4_4_;
              uStack_738 = local_560._8_8_;
              local_6a0 = local_570._0_4_;
              fStack_69c = local_570._4_4_;
              fStack_698 = local_570._8_4_;
              fStack_694 = local_570._12_4_;
              uVar83 = CONCAT71((int7)((ulong)lVar87 >> 8),1);
              local_6e0 = auVar101;
              local_680 = fVar167;
              local_4a0 = auVar104;
              local_460 = auVar103;
              local_43c = iVar10;
              local_430 = auVar21;
              local_340 = auVar105;
              do {
                auVar92 = auVar202._0_16_;
                local_4e0 = (undefined4)uVar85;
                uStack_4dc = (undefined4)(uVar85 >> 0x20);
                local_720._0_4_ = (int)uVar83;
                local_500 = *(float *)(ray + k * 4 + 0x100);
                local_260 = local_3e0[lVar87];
                local_380._0_8_ = lVar87;
                local_240 = *(undefined4 *)((long)&local_3c0 + lVar87 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + lVar87 * 4);
                local_7b0.context = context->user;
                fVar174 = 1.0 - local_260;
                fVar146 = fVar174 * fVar174 * -3.0;
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                          ZEXT416((uint)(local_260 * fVar174)),ZEXT416(0xc0000000));
                auVar94 = vfmsub132ss_fma(ZEXT416((uint)(local_260 * fVar174)),
                                          ZEXT416((uint)(local_260 * local_260)),ZEXT416(0x40000000)
                                         );
                fVar174 = auVar95._0_4_ * 3.0;
                fVar175 = auVar94._0_4_ * 3.0;
                fVar176 = local_260 * local_260 * 3.0;
                auVar177._0_4_ = fVar176 * local_6a0;
                auVar177._4_4_ = fVar176 * fStack_69c;
                auVar177._8_4_ = fVar176 * fStack_698;
                auVar177._12_4_ = fVar176 * fStack_694;
                auVar149._4_4_ = fVar175;
                auVar149._0_4_ = fVar175;
                auVar149._8_4_ = fVar175;
                auVar149._12_4_ = fVar175;
                auVar72._4_4_ = uStack_73c;
                auVar72._0_4_ = local_740;
                auVar72._8_8_ = uStack_738;
                auVar95 = vfmadd132ps_fma(auVar149,auVar177,auVar72);
                auVar162._4_4_ = fVar174;
                auVar162._0_4_ = fVar174;
                auVar162._8_4_ = fVar174;
                auVar162._12_4_ = fVar174;
                auVar73._8_8_ = uStack_728;
                auVar73._0_8_ = local_730;
                auVar95 = vfmadd132ps_fma(auVar162,auVar95,auVar73);
                auVar150._4_4_ = fVar146;
                auVar150._0_4_ = fVar146;
                auVar150._8_4_ = fVar146;
                auVar150._12_4_ = fVar146;
                auVar95 = vfmadd213ps_fma(auVar150,auVar21,auVar95);
                local_2c0 = auVar95._0_4_;
                auVar170._8_4_ = 1;
                auVar170._0_8_ = 0x100000001;
                auVar170._12_4_ = 1;
                auVar170._16_4_ = 1;
                auVar170._20_4_ = 1;
                auVar170._24_4_ = 1;
                auVar170._28_4_ = 1;
                local_2a0 = vpermps_avx2(auVar170,ZEXT1632(auVar95));
                auVar180._8_4_ = 2;
                auVar180._0_8_ = 0x200000002;
                auVar180._12_4_ = 2;
                auVar180._16_4_ = 2;
                auVar180._20_4_ = 2;
                auVar180._24_4_ = 2;
                auVar180._28_4_ = 2;
                local_280 = vpermps_avx2(auVar180,ZEXT1632(auVar95));
                uStack_2bc = local_2c0;
                uStack_2b8 = local_2c0;
                uStack_2b4 = local_2c0;
                uStack_2b0 = local_2c0;
                uStack_2ac = local_2c0;
                uStack_2a8 = local_2c0;
                uStack_2a4 = local_2c0;
                fStack_25c = local_260;
                fStack_258 = local_260;
                fStack_254 = local_260;
                fStack_250 = local_260;
                fStack_24c = local_260;
                fStack_248 = local_260;
                fStack_244 = local_260;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                local_220 = local_540._0_8_;
                uStack_218 = local_540._8_8_;
                uStack_210 = local_540._16_8_;
                uStack_208 = local_540._24_8_;
                local_200 = local_520;
                vpcmpeqd_avx2(local_520,local_520);
                local_1e0 = (local_7b0.context)->instID[0];
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = (local_7b0.context)->instPrimID[0];
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_6c0 = local_2e0._0_8_;
                uStack_6b8 = local_2e0._8_8_;
                uStack_6b0 = local_2e0._16_8_;
                uStack_6a8 = local_2e0._24_8_;
                local_7b0.valid = (int *)&local_6c0;
                local_7b0.geometryUserPtr = *(void **)(local_620._0_8_ + 0x18);
                local_7b0.hit = (RTCHitN *)&local_2c0;
                local_7b0.N = 8;
                local_7b0.ray = (RTCRayN *)ray;
                if (*(code **)(local_620._0_8_ + 0x48) != (code *)0x0) {
                  (**(code **)(local_620._0_8_ + 0x48))(&local_7b0);
                  auVar195 = ZEXT1664(local_750);
                  auVar187 = ZEXT3264(local_6e0);
                  auVar204 = ZEXT3264(local_660);
                  auVar203 = ZEXT3264(local_640);
                  auVar199 = ZEXT3264(local_700);
                  auVar200 = ZEXT3264(local_5c0);
                  auVar201 = ZEXT3264(local_5a0);
                  in_ZMM21 = ZEXT3264(local_600);
                  in_ZMM20 = ZEXT3264(local_5e0);
                  auVar95 = vxorps_avx512vl(auVar92,auVar92);
                  auVar202 = ZEXT1664(auVar95);
                  fVar167 = local_680;
                }
                auVar95 = auVar202._0_16_;
                auVar74._8_8_ = uStack_6b8;
                auVar74._0_8_ = local_6c0;
                auVar74._16_8_ = uStack_6b0;
                auVar74._24_8_ = uStack_6a8;
                if (auVar74 == (undefined1  [32])0x0) {
                  uVar85 = CONCAT44(uStack_4dc,local_4e0);
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_620._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_7b0);
                    auVar195 = ZEXT1664(local_750);
                    auVar187 = ZEXT3264(local_6e0);
                    auVar204 = ZEXT3264(local_660);
                    auVar203 = ZEXT3264(local_640);
                    auVar199 = ZEXT3264(local_700);
                    auVar200 = ZEXT3264(local_5c0);
                    auVar201 = ZEXT3264(local_5a0);
                    in_ZMM21 = ZEXT3264(local_600);
                    in_ZMM20 = ZEXT3264(local_5e0);
                    auVar95 = vxorps_avx512vl(auVar95,auVar95);
                    auVar202 = ZEXT1664(auVar95);
                    fVar167 = local_680;
                  }
                  auVar101 = auVar187._0_32_;
                  auVar75._8_8_ = uStack_6b8;
                  auVar75._0_8_ = local_6c0;
                  auVar75._16_8_ = uStack_6b0;
                  auVar75._24_8_ = uStack_6a8;
                  uVar83 = vptestmd_avx512vl(auVar75,auVar75);
                  auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar83 & 1);
                  bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                  bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                  bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
                  bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
                  bVar18 = (bool)((byte)(uVar83 >> 5) & 1);
                  bVar19 = (bool)((byte)(uVar83 >> 6) & 1);
                  bVar20 = SUB81(uVar83 >> 7,0);
                  *(uint *)(local_7b0.ray + 0x100) =
                       (uint)bVar13 * auVar105._0_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x100);
                  *(uint *)(local_7b0.ray + 0x104) =
                       (uint)bVar14 * auVar105._4_4_ |
                       (uint)!bVar14 * *(int *)(local_7b0.ray + 0x104);
                  *(uint *)(local_7b0.ray + 0x108) =
                       (uint)bVar15 * auVar105._8_4_ |
                       (uint)!bVar15 * *(int *)(local_7b0.ray + 0x108);
                  *(uint *)(local_7b0.ray + 0x10c) =
                       (uint)bVar16 * auVar105._12_4_ |
                       (uint)!bVar16 * *(int *)(local_7b0.ray + 0x10c);
                  *(uint *)(local_7b0.ray + 0x110) =
                       (uint)bVar17 * auVar105._16_4_ |
                       (uint)!bVar17 * *(int *)(local_7b0.ray + 0x110);
                  *(uint *)(local_7b0.ray + 0x114) =
                       (uint)bVar18 * auVar105._20_4_ |
                       (uint)!bVar18 * *(int *)(local_7b0.ray + 0x114);
                  *(uint *)(local_7b0.ray + 0x118) =
                       (uint)bVar19 * auVar105._24_4_ |
                       (uint)!bVar19 * *(int *)(local_7b0.ray + 0x118);
                  *(uint *)(local_7b0.ray + 0x11c) =
                       (uint)bVar20 * auVar105._28_4_ |
                       (uint)!bVar20 * *(int *)(local_7b0.ray + 0x11c);
                  uVar85 = CONCAT44(uStack_4dc,local_4e0);
                  if (auVar75 != (undefined1  [32])0x0) {
                    uVar83 = (ulong)(uint)local_720._0_4_;
                    fVar146 = auVar195._0_4_;
                    break;
                  }
                }
                auVar101 = auVar187._0_32_;
                *(float *)(ray + k * 4 + 0x100) = local_500;
                lVar87 = 0;
                uVar85 = uVar85 ^ 1L << (local_380._0_8_ & 0x3f);
                for (uVar83 = uVar85; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  lVar87 = lVar87 + 1;
                }
                uVar83 = CONCAT71((int7)((ulong)pre >> 8),uVar85 != 0);
                fVar146 = auVar195._0_4_;
              } while (uVar85 != 0);
              local_680 = fVar146;
              auVar184 = ZEXT3264(auVar104);
              auVar157 = ZEXT3264(auVar103);
              uVar83 = uVar83 & 0xffffffffffffff01;
            }
            uVar83 = uVar83 & 0xffffffff;
          }
        }
      }
      if (8 < iVar10) {
        local_620 = vpbroadcastd_avx512vl();
        local_500 = 1.0 / (float)local_4c0._0_4_;
        auVar81._28_4_ = 0;
        auVar81._0_28_ = stack0xfffffffffffff884;
        _local_780 = auVar81 << 0x20;
        local_4c0 = vpbroadcastd_avx512vl();
        local_380 = vpbroadcastd_avx512vl();
        lVar87 = 8;
        auVar103 = auVar184._0_32_;
        auVar105 = auVar157._0_32_;
        local_6e0 = auVar101;
        fStack_67c = local_680;
        fStack_678 = local_680;
        fStack_674 = local_680;
        fStack_670 = local_680;
        fStack_66c = local_680;
        fStack_668 = local_680;
        fStack_664 = local_680;
        fStack_4fc = local_500;
        fStack_4f8 = local_500;
        fStack_4f4 = local_500;
        fStack_4f0 = local_500;
        fStack_4ec = local_500;
        fStack_4e8 = local_500;
        fStack_4e4 = local_500;
        local_4e0 = fVar167;
        uStack_4dc = fVar167;
        uStack_4d8 = fVar167;
        uStack_4d4 = fVar167;
        uStack_4d0 = fVar167;
        uStack_4cc = fVar167;
        uStack_4c8 = fVar167;
        uStack_4c4 = fVar167;
        do {
          uVar82 = (uint)uVar83;
          local_720._0_4_ = uVar82;
          auVar104 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar106,local_620,1);
          auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar70);
          auVar115 = *(undefined1 (*) [32])(lVar70 + 0x2227768 + lVar87 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar70 + 0x2227bec + lVar87 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar70 + 0x2228070 + lVar87 * 4);
          local_640 = auVar203._0_32_;
          auVar107 = vmulps_avx512vl(local_640,auVar113);
          local_660 = auVar204._0_32_;
          auVar112 = vmulps_avx512vl(local_660,auVar113);
          auVar51._4_4_ = auVar113._4_4_ * (float)local_140._4_4_;
          auVar51._0_4_ = auVar113._0_4_ * (float)local_140._0_4_;
          auVar51._8_4_ = auVar113._8_4_ * fStack_138;
          auVar51._12_4_ = auVar113._12_4_ * fStack_134;
          auVar51._16_4_ = auVar113._16_4_ * fStack_130;
          auVar51._20_4_ = auVar113._20_4_ * fStack_12c;
          auVar51._24_4_ = auVar113._24_4_ * fStack_128;
          auVar51._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar114,local_a0);
          auVar107 = vfmadd231ps_avx512vl(auVar112,auVar114,local_c0);
          auVar112 = vfmadd231ps_avx512vl(auVar51,auVar114,local_120);
          auVar183 = auVar199._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,auVar183);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_320);
          auVar95 = vfmadd231ps_fma(auVar112,auVar115,local_100);
          auVar193 = auVar201._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar193);
          auVar185 = auVar200._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar185);
          auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar70);
          auVar107 = *(undefined1 (*) [32])(lVar70 + 0x2229b88 + lVar87 * 4);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar104,local_e0);
          auVar112 = *(undefined1 (*) [32])(lVar70 + 0x222a00c + lVar87 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar70 + 0x222a490 + lVar87 * 4);
          auVar101 = vmulps_avx512vl(local_640,auVar111);
          auVar102 = vmulps_avx512vl(local_660,auVar111);
          auVar52._4_4_ = auVar111._4_4_ * (float)local_140._4_4_;
          auVar52._0_4_ = auVar111._0_4_ * (float)local_140._0_4_;
          auVar52._8_4_ = auVar111._8_4_ * fStack_138;
          auVar52._12_4_ = auVar111._12_4_ * fStack_134;
          auVar52._16_4_ = auVar111._16_4_ * fStack_130;
          auVar52._20_4_ = auVar111._20_4_ * fStack_12c;
          auVar52._24_4_ = auVar111._24_4_ * fStack_128;
          auVar52._28_4_ = uStack_124;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_a0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar52,auVar112,local_120);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar183);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_320);
          auVar94 = vfmadd231ps_fma(auVar100,auVar107,local_100);
          auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar193);
          auVar109 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar185);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_e0);
          auVar110 = vmaxps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
          auVar101 = vsubps_avx(auVar100,auVar108);
          auVar102 = vsubps_avx(auVar109,auVar99);
          auVar126 = vmulps_avx512vl(auVar99,auVar101);
          auVar127 = vmulps_avx512vl(auVar108,auVar102);
          auVar126 = vsubps_avx512vl(auVar126,auVar127);
          auVar127 = vmulps_avx512vl(auVar102,auVar102);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar101,auVar101);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar127);
          auVar126 = vmulps_avx512vl(auVar126,auVar126);
          uVar148 = vcmpps_avx512vl(auVar126,auVar110,2);
          local_3f0 = (byte)uVar22 & (byte)uVar148;
          if (local_3f0 == 0) {
            auVar199 = ZEXT3264(auVar183);
LAB_01d23300:
            auVar195 = ZEXT3264(auVar185);
          }
          else {
            auVar111 = vmulps_avx512vl(local_6e0,auVar111);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar112);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
            auVar113 = vmulps_avx512vl(local_6e0,auVar113);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
            auVar107 = vfmadd213ps_avx512vl(auVar104,local_160,auVar115);
            auVar104 = *(undefined1 (*) [32])(lVar70 + 0x22284f4 + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar70 + 0x2228978 + lVar87 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar70 + 0x2228dfc + lVar87 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar70 + 0x2229280 + lVar87 * 4);
            auVar112 = vmulps_avx512vl(local_640,auVar113);
            auVar111 = vmulps_avx512vl(local_660,auVar113);
            auVar113 = vmulps_avx512vl(local_6e0,auVar113);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_a0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar183);
            auVar112 = vfmadd231ps_avx512vl(auVar111,auVar115,local_320);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,auVar193);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,auVar185);
            auVar111 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar70 + 0x222a914 + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222b21c + lVar87 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar70 + 0x222b6a0 + lVar87 * 4);
            auVar110 = vmulps_avx512vl(local_640,auVar114);
            auVar126 = vmulps_avx512vl(local_660,auVar114);
            auVar114 = vmulps_avx512vl(local_6e0,auVar114);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_a0);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar115,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar70 + 0x222ad98 + lVar87 * 4);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar183);
            auVar92 = vfmadd231ps_fma(auVar126,auVar115,local_320);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar193);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar104,auVar185);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar113,auVar126);
            vandps_avx512vl(auVar112,auVar126);
            auVar104 = vmaxps_avx(auVar126,auVar126);
            vandps_avx512vl(auVar111,auVar126);
            auVar104 = vmaxps_avx(auVar104,auVar126);
            auVar79._4_4_ = fStack_67c;
            auVar79._0_4_ = local_680;
            auVar79._8_4_ = fStack_678;
            auVar79._12_4_ = fStack_674;
            auVar79._16_4_ = fStack_670;
            auVar79._20_4_ = fStack_66c;
            auVar79._24_4_ = fStack_668;
            auVar79._28_4_ = fStack_664;
            uVar83 = vcmpps_avx512vl(auVar104,auVar79,1);
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar128._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar113._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar113._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar113._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar113._12_4_);
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar113._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar113._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar113._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar128._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar113._28_4_;
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar129._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar112._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar112._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar112._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar112._12_4_);
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar112._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar112._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar112._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar129._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar112._28_4_;
            vandps_avx512vl(auVar114,auVar126);
            vandps_avx512vl(auVar110,auVar126);
            auVar104 = vmaxps_avx(auVar129,auVar129);
            vandps_avx512vl(auVar115,auVar126);
            auVar104 = vmaxps_avx(auVar104,auVar129);
            uVar83 = vcmpps_avx512vl(auVar104,auVar79,1);
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar130._0_4_ = (uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar114._0_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar114._4_4_;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar114._8_4_;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar114._12_4_;
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar130._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar114._16_4_;
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar130._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar114._20_4_;
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar130._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar114._24_4_;
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar130._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar114._28_4_;
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar131._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar110._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar110._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar110._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar110._12_4_);
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar110._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar110._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar110._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar131._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar110._28_4_;
            auVar189._8_4_ = 0x80000000;
            auVar189._0_8_ = 0x8000000080000000;
            auVar189._12_4_ = 0x80000000;
            auVar189._16_4_ = 0x80000000;
            auVar189._20_4_ = 0x80000000;
            auVar189._24_4_ = 0x80000000;
            auVar189._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar130,auVar189);
            auVar110 = auVar202._0_32_;
            auVar115 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar110);
            auVar92 = vfmadd231ps_fma(auVar115,auVar129,auVar129);
            auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
            auVar198._8_4_ = 0xbf000000;
            auVar198._0_8_ = 0xbf000000bf000000;
            auVar198._12_4_ = 0xbf000000;
            auVar198._16_4_ = 0xbf000000;
            auVar198._20_4_ = 0xbf000000;
            auVar198._24_4_ = 0xbf000000;
            auVar198._28_4_ = 0xbf000000;
            fVar167 = auVar115._0_4_;
            fVar146 = auVar115._4_4_;
            fVar174 = auVar115._8_4_;
            fVar175 = auVar115._12_4_;
            fVar176 = auVar115._16_4_;
            fVar159 = auVar115._20_4_;
            fVar166 = auVar115._24_4_;
            auVar53._4_4_ = fVar146 * fVar146 * fVar146 * auVar92._4_4_ * -0.5;
            auVar53._0_4_ = fVar167 * fVar167 * fVar167 * auVar92._0_4_ * -0.5;
            auVar53._8_4_ = fVar174 * fVar174 * fVar174 * auVar92._8_4_ * -0.5;
            auVar53._12_4_ = fVar175 * fVar175 * fVar175 * auVar92._12_4_ * -0.5;
            auVar53._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar53._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar53._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar53._28_4_ = auVar129._28_4_;
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar115 = vfmadd231ps_avx512vl(auVar53,auVar114,auVar115);
            auVar54._4_4_ = auVar129._4_4_ * auVar115._4_4_;
            auVar54._0_4_ = auVar129._0_4_ * auVar115._0_4_;
            auVar54._8_4_ = auVar129._8_4_ * auVar115._8_4_;
            auVar54._12_4_ = auVar129._12_4_ * auVar115._12_4_;
            auVar54._16_4_ = auVar129._16_4_ * auVar115._16_4_;
            auVar54._20_4_ = auVar129._20_4_ * auVar115._20_4_;
            auVar54._24_4_ = auVar129._24_4_ * auVar115._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar115._4_4_ * -auVar128._4_4_;
            auVar55._0_4_ = auVar115._0_4_ * -auVar128._0_4_;
            auVar55._8_4_ = auVar115._8_4_ * -auVar128._8_4_;
            auVar55._12_4_ = auVar115._12_4_ * -auVar128._12_4_;
            auVar55._16_4_ = auVar115._16_4_ * -auVar128._16_4_;
            auVar55._20_4_ = auVar115._20_4_ * -auVar128._20_4_;
            auVar55._24_4_ = auVar115._24_4_ * -auVar128._24_4_;
            auVar55._28_4_ = auVar129._28_4_;
            auVar113 = vmulps_avx512vl(auVar115,auVar110);
            auVar115 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar110);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar131,auVar131);
            auVar112 = vrsqrt14ps_avx512vl(auVar115);
            auVar115 = vmulps_avx512vl(auVar115,auVar198);
            fVar167 = auVar112._0_4_;
            fVar146 = auVar112._4_4_;
            fVar174 = auVar112._8_4_;
            fVar175 = auVar112._12_4_;
            fVar176 = auVar112._16_4_;
            fVar159 = auVar112._20_4_;
            fVar166 = auVar112._24_4_;
            auVar56._4_4_ = fVar146 * fVar146 * fVar146 * auVar115._4_4_;
            auVar56._0_4_ = fVar167 * fVar167 * fVar167 * auVar115._0_4_;
            auVar56._8_4_ = fVar174 * fVar174 * fVar174 * auVar115._8_4_;
            auVar56._12_4_ = fVar175 * fVar175 * fVar175 * auVar115._12_4_;
            auVar56._16_4_ = fVar176 * fVar176 * fVar176 * auVar115._16_4_;
            auVar56._20_4_ = fVar159 * fVar159 * fVar159 * auVar115._20_4_;
            auVar56._24_4_ = fVar166 * fVar166 * fVar166 * auVar115._24_4_;
            auVar56._28_4_ = auVar115._28_4_;
            auVar115 = vfmadd231ps_avx512vl(auVar56,auVar114,auVar112);
            auVar57._4_4_ = auVar131._4_4_ * auVar115._4_4_;
            auVar57._0_4_ = auVar131._0_4_ * auVar115._0_4_;
            auVar57._8_4_ = auVar131._8_4_ * auVar115._8_4_;
            auVar57._12_4_ = auVar131._12_4_ * auVar115._12_4_;
            auVar57._16_4_ = auVar131._16_4_ * auVar115._16_4_;
            auVar57._20_4_ = auVar131._20_4_ * auVar115._20_4_;
            auVar57._24_4_ = auVar131._24_4_ * auVar115._24_4_;
            auVar57._28_4_ = auVar112._28_4_;
            auVar58._4_4_ = auVar115._4_4_ * auVar104._4_4_;
            auVar58._0_4_ = auVar115._0_4_ * auVar104._0_4_;
            auVar58._8_4_ = auVar115._8_4_ * auVar104._8_4_;
            auVar58._12_4_ = auVar115._12_4_ * auVar104._12_4_;
            auVar58._16_4_ = auVar115._16_4_ * auVar104._16_4_;
            auVar58._20_4_ = auVar115._20_4_ * auVar104._20_4_;
            auVar58._24_4_ = auVar115._24_4_ * auVar104._24_4_;
            auVar58._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar115,auVar110);
            auVar92 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar95),auVar108);
            auVar115 = ZEXT1632(auVar95);
            auVar5 = vfmadd213ps_fma(auVar55,auVar115,auVar99);
            auVar114 = vfmadd213ps_avx512vl(auVar113,auVar115,auVar107);
            auVar112 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar94),auVar100);
            auVar96 = vfnmadd213ps_fma(auVar54,auVar115,auVar108);
            auVar111 = ZEXT1632(auVar94);
            auVar6 = vfmadd213ps_fma(auVar58,auVar111,auVar109);
            auVar97 = vfnmadd213ps_fma(auVar55,auVar115,auVar99);
            auVar7 = vfmadd213ps_fma(auVar104,auVar111,auVar106);
            auVar99 = ZEXT1632(auVar95);
            auVar98 = vfnmadd231ps_fma(auVar107,auVar99,auVar113);
            auVar160 = vfnmadd213ps_fma(auVar57,auVar111,auVar100);
            auVar161 = vfnmadd213ps_fma(auVar58,auVar111,auVar109);
            auVar188 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar94),auVar104);
            auVar106 = vsubps_avx512vl(auVar112,ZEXT1632(auVar96));
            auVar104 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar97));
            auVar115 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar98));
            auVar59._4_4_ = auVar104._4_4_ * auVar98._4_4_;
            auVar59._0_4_ = auVar104._0_4_ * auVar98._0_4_;
            auVar59._8_4_ = auVar104._8_4_ * auVar98._8_4_;
            auVar59._12_4_ = auVar104._12_4_ * auVar98._12_4_;
            auVar59._16_4_ = auVar104._16_4_ * 0.0;
            auVar59._20_4_ = auVar104._20_4_ * 0.0;
            auVar59._24_4_ = auVar104._24_4_ * 0.0;
            auVar59._28_4_ = auVar113._28_4_;
            auVar95 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar97),auVar115);
            auVar60._4_4_ = auVar115._4_4_ * auVar96._4_4_;
            auVar60._0_4_ = auVar115._0_4_ * auVar96._0_4_;
            auVar60._8_4_ = auVar115._8_4_ * auVar96._8_4_;
            auVar60._12_4_ = auVar115._12_4_ * auVar96._12_4_;
            auVar60._16_4_ = auVar115._16_4_ * 0.0;
            auVar60._20_4_ = auVar115._20_4_ * 0.0;
            auVar60._24_4_ = auVar115._24_4_ * 0.0;
            auVar60._28_4_ = auVar115._28_4_;
            auVar8 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar98),auVar106);
            auVar61._4_4_ = auVar97._4_4_ * auVar106._4_4_;
            auVar61._0_4_ = auVar97._0_4_ * auVar106._0_4_;
            auVar61._8_4_ = auVar97._8_4_ * auVar106._8_4_;
            auVar61._12_4_ = auVar97._12_4_ * auVar106._12_4_;
            auVar61._16_4_ = auVar106._16_4_ * 0.0;
            auVar61._20_4_ = auVar106._20_4_ * 0.0;
            auVar61._24_4_ = auVar106._24_4_ * 0.0;
            auVar61._28_4_ = auVar106._28_4_;
            auVar93 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar96),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar110,ZEXT1632(auVar8));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar95));
            uVar83 = vcmpps_avx512vl(auVar104,auVar110,2);
            bVar86 = (byte)uVar83;
            fVar138 = (float)((uint)(bVar86 & 1) * auVar92._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * auVar160._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar140 = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar160._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar142 = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar160._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar144 = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar160._12_4_);
            auVar111 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
            fVar139 = (float)((uint)(bVar86 & 1) * auVar5._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * auVar161._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar141 = (float)((uint)bVar13 * auVar5._4_4_ | (uint)!bVar13 * auVar161._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar143 = (float)((uint)bVar13 * auVar5._8_4_ | (uint)!bVar13 * auVar161._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar145 = (float)((uint)bVar13 * auVar5._12_4_ | (uint)!bVar13 * auVar161._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar139))));
            auVar132._0_4_ =
                 (float)((uint)(bVar86 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar188._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar188._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar188._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar188._12_4_);
            fVar174 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_);
            auVar132._16_4_ = fVar174;
            fVar146 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_);
            auVar132._20_4_ = fVar146;
            fVar167 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_);
            auVar132._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar114._28_4_;
            auVar132._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar112);
            auVar133._0_4_ =
                 (uint)(bVar86 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar95._0_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar95._4_4_;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar95._8_4_;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar95._12_4_;
            auVar133._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_;
            auVar133._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_;
            auVar133._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_;
            auVar133._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar6));
            auVar134._0_4_ =
                 (float)((uint)(bVar86 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar92._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar92._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar92._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar92._12_4_);
            fVar159 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_);
            auVar134._16_4_ = fVar159;
            fVar175 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_);
            auVar134._20_4_ = fVar175;
            fVar176 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_);
            auVar134._24_4_ = fVar176;
            auVar134._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar7));
            auVar135._0_4_ =
                 (float)((uint)(bVar86 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar86 & 1) * auVar5._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar5._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar5._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar5._12_4_);
            fVar158 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_);
            auVar135._16_4_ = fVar158;
            fVar91 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_);
            auVar135._20_4_ = fVar91;
            fVar166 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_);
            auVar135._24_4_ = fVar166;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
            auVar135._28_4_ = iVar2;
            auVar136._0_4_ =
                 (uint)(bVar86 & 1) * (int)auVar96._0_4_ |
                 (uint)!(bool)(bVar86 & 1) * auVar112._0_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar13 * (int)auVar96._4_4_ | (uint)!bVar13 * auVar112._4_4_;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar13 * (int)auVar96._8_4_ | (uint)!bVar13 * auVar112._8_4_;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar13 * (int)auVar96._12_4_ | (uint)!bVar13 * auVar112._12_4_;
            auVar136._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_;
            auVar136._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_;
            auVar136._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_;
            auVar136._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar112._28_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar112 = vsubps_avx512vl(auVar136,auVar111);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar97._12_4_ |
                                                     (uint)!bVar17 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar97._8_4_ |
                                                              (uint)!bVar15 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar13 * auVar6._4_4_,
                                                                       (uint)(bVar86 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar86 & 1) *
                                                                       auVar6._0_4_)))),auVar101);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar98._12_4_ |
                                                     (uint)!bVar18 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar98._8_4_ |
                                                              (uint)!bVar16 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar98._4_4_ |
                                                                       (uint)!bVar14 * auVar7._4_4_,
                                                                       (uint)(bVar86 & 1) *
                                                                       (int)auVar98._0_4_ |
                                                                       (uint)!(bool)(bVar86 & 1) *
                                                                       auVar7._0_4_)))),auVar132);
            auVar113 = vsubps_avx(auVar111,auVar133);
            auVar106 = vsubps_avx(auVar101,auVar134);
            auVar107 = vsubps_avx(auVar132,auVar135);
            auVar62._4_4_ = auVar114._4_4_ * fVar140;
            auVar62._0_4_ = auVar114._0_4_ * fVar138;
            auVar62._8_4_ = auVar114._8_4_ * fVar142;
            auVar62._12_4_ = auVar114._12_4_ * fVar144;
            auVar62._16_4_ = auVar114._16_4_ * 0.0;
            auVar62._20_4_ = auVar114._20_4_ * 0.0;
            auVar62._24_4_ = auVar114._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar62,auVar132,auVar112);
            auVar165._0_4_ = fVar139 * auVar112._0_4_;
            auVar165._4_4_ = fVar141 * auVar112._4_4_;
            auVar165._8_4_ = fVar143 * auVar112._8_4_;
            auVar165._12_4_ = fVar145 * auVar112._12_4_;
            auVar165._16_4_ = auVar112._16_4_ * 0.0;
            auVar165._20_4_ = auVar112._20_4_ * 0.0;
            auVar165._24_4_ = auVar112._24_4_ * 0.0;
            auVar165._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar165,auVar111,auVar115);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar110,ZEXT1632(auVar95));
            auVar171._0_4_ = auVar115._0_4_ * auVar132._0_4_;
            auVar171._4_4_ = auVar115._4_4_ * auVar132._4_4_;
            auVar171._8_4_ = auVar115._8_4_ * auVar132._8_4_;
            auVar171._12_4_ = auVar115._12_4_ * auVar132._12_4_;
            auVar171._16_4_ = auVar115._16_4_ * fVar174;
            auVar171._20_4_ = auVar115._20_4_ * fVar146;
            auVar171._24_4_ = auVar115._24_4_ * fVar167;
            auVar171._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar171,auVar101,auVar114);
            auVar102 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar95));
            auVar104 = vmulps_avx512vl(auVar107,auVar133);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar135);
            auVar63._4_4_ = auVar106._4_4_ * auVar135._4_4_;
            auVar63._0_4_ = auVar106._0_4_ * auVar135._0_4_;
            auVar63._8_4_ = auVar106._8_4_ * auVar135._8_4_;
            auVar63._12_4_ = auVar106._12_4_ * auVar135._12_4_;
            auVar63._16_4_ = auVar106._16_4_ * fVar158;
            auVar63._20_4_ = auVar106._20_4_ * fVar91;
            auVar63._24_4_ = auVar106._24_4_ * fVar166;
            auVar63._28_4_ = iVar2;
            auVar95 = vfmsub231ps_fma(auVar63,auVar134,auVar107);
            auVar172._0_4_ = auVar134._0_4_ * auVar113._0_4_;
            auVar172._4_4_ = auVar134._4_4_ * auVar113._4_4_;
            auVar172._8_4_ = auVar134._8_4_ * auVar113._8_4_;
            auVar172._12_4_ = auVar134._12_4_ * auVar113._12_4_;
            auVar172._16_4_ = fVar159 * auVar113._16_4_;
            auVar172._20_4_ = fVar175 * auVar113._20_4_;
            auVar172._24_4_ = fVar176 * auVar113._24_4_;
            auVar172._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar172,auVar106,auVar133);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar110,auVar104);
            auVar108 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar95));
            auVar104 = vmaxps_avx(auVar102,auVar108);
            uVar148 = vcmpps_avx512vl(auVar104,auVar110,2);
            local_3f0 = local_3f0 & (byte)uVar148;
            auVar195 = ZEXT3264(auVar185);
            if (local_3f0 == 0) {
LAB_01d23341:
              local_3f0 = 0;
            }
            else {
              auVar64._4_4_ = auVar107._4_4_ * auVar115._4_4_;
              auVar64._0_4_ = auVar107._0_4_ * auVar115._0_4_;
              auVar64._8_4_ = auVar107._8_4_ * auVar115._8_4_;
              auVar64._12_4_ = auVar107._12_4_ * auVar115._12_4_;
              auVar64._16_4_ = auVar107._16_4_ * auVar115._16_4_;
              auVar64._20_4_ = auVar107._20_4_ * auVar115._20_4_;
              auVar64._24_4_ = auVar107._24_4_ * auVar115._24_4_;
              auVar64._28_4_ = auVar104._28_4_;
              auVar5 = vfmsub231ps_fma(auVar64,auVar106,auVar114);
              auVar65._4_4_ = auVar114._4_4_ * auVar113._4_4_;
              auVar65._0_4_ = auVar114._0_4_ * auVar113._0_4_;
              auVar65._8_4_ = auVar114._8_4_ * auVar113._8_4_;
              auVar65._12_4_ = auVar114._12_4_ * auVar113._12_4_;
              auVar65._16_4_ = auVar114._16_4_ * auVar113._16_4_;
              auVar65._20_4_ = auVar114._20_4_ * auVar113._20_4_;
              auVar65._24_4_ = auVar114._24_4_ * auVar113._24_4_;
              auVar65._28_4_ = auVar114._28_4_;
              auVar92 = vfmsub231ps_fma(auVar65,auVar112,auVar107);
              auVar66._4_4_ = auVar106._4_4_ * auVar112._4_4_;
              auVar66._0_4_ = auVar106._0_4_ * auVar112._0_4_;
              auVar66._8_4_ = auVar106._8_4_ * auVar112._8_4_;
              auVar66._12_4_ = auVar106._12_4_ * auVar112._12_4_;
              auVar66._16_4_ = auVar106._16_4_ * auVar112._16_4_;
              auVar66._20_4_ = auVar106._20_4_ * auVar112._20_4_;
              auVar66._24_4_ = auVar106._24_4_ * auVar112._24_4_;
              auVar66._28_4_ = auVar106._28_4_;
              auVar6 = vfmsub231ps_fma(auVar66,auVar113,auVar115);
              auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar6));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar5),auVar110);
              auVar115 = vrcp14ps_avx512vl(auVar104);
              auVar28._8_4_ = 0x3f800000;
              auVar28._0_8_ = &DAT_3f8000003f800000;
              auVar28._12_4_ = 0x3f800000;
              auVar28._16_4_ = 0x3f800000;
              auVar28._20_4_ = 0x3f800000;
              auVar28._24_4_ = 0x3f800000;
              auVar28._28_4_ = 0x3f800000;
              auVar114 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar28);
              auVar95 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
              auVar67._4_4_ = auVar6._4_4_ * auVar132._4_4_;
              auVar67._0_4_ = auVar6._0_4_ * auVar132._0_4_;
              auVar67._8_4_ = auVar6._8_4_ * auVar132._8_4_;
              auVar67._12_4_ = auVar6._12_4_ * auVar132._12_4_;
              auVar67._16_4_ = fVar174 * 0.0;
              auVar67._20_4_ = fVar146 * 0.0;
              auVar67._24_4_ = fVar167 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar92 = vfmadd231ps_fma(auVar67,auVar101,ZEXT1632(auVar92));
              auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar111,ZEXT1632(auVar5));
              fVar167 = auVar95._0_4_;
              fVar146 = auVar95._4_4_;
              fVar174 = auVar95._8_4_;
              fVar175 = auVar95._12_4_;
              auVar115 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar175,
                                            CONCAT48(auVar92._8_4_ * fVar174,
                                                     CONCAT44(auVar92._4_4_ * fVar146,
                                                              auVar92._0_4_ * fVar167))));
              auVar80._4_4_ = uStack_4dc;
              auVar80._0_4_ = local_4e0;
              auVar80._8_4_ = uStack_4d8;
              auVar80._12_4_ = uStack_4d4;
              auVar80._16_4_ = uStack_4d0;
              auVar80._20_4_ = uStack_4cc;
              auVar80._24_4_ = uStack_4c8;
              auVar80._28_4_ = uStack_4c4;
              uVar148 = vcmpps_avx512vl(auVar115,auVar80,0xd);
              uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar29._4_4_ = uVar147;
              auVar29._0_4_ = uVar147;
              auVar29._8_4_ = uVar147;
              auVar29._12_4_ = uVar147;
              auVar29._16_4_ = uVar147;
              auVar29._20_4_ = uVar147;
              auVar29._24_4_ = uVar147;
              auVar29._28_4_ = uVar147;
              uVar22 = vcmpps_avx512vl(auVar115,auVar29,2);
              local_3f0 = (byte)uVar148 & (byte)uVar22 & local_3f0;
              if (local_3f0 == 0) goto LAB_01d23341;
              uVar148 = vcmpps_avx512vl(auVar104,auVar110,4);
              if ((local_3f0 & (byte)uVar148) == 0) {
                local_3f0 = 0;
              }
              else {
                local_3f0 = local_3f0 & (byte)uVar148;
                fVar176 = auVar102._0_4_ * fVar167;
                fVar159 = auVar102._4_4_ * fVar146;
                auVar68._4_4_ = fVar159;
                auVar68._0_4_ = fVar176;
                fVar166 = auVar102._8_4_ * fVar174;
                auVar68._8_4_ = fVar166;
                fVar91 = auVar102._12_4_ * fVar175;
                auVar68._12_4_ = fVar91;
                fVar158 = auVar102._16_4_ * 0.0;
                auVar68._16_4_ = fVar158;
                fVar138 = auVar102._20_4_ * 0.0;
                auVar68._20_4_ = fVar138;
                fVar139 = auVar102._24_4_ * 0.0;
                auVar68._24_4_ = fVar139;
                auVar68._28_4_ = auVar102._28_4_;
                fVar167 = auVar108._0_4_ * fVar167;
                fVar146 = auVar108._4_4_ * fVar146;
                auVar69._4_4_ = fVar146;
                auVar69._0_4_ = fVar167;
                fVar174 = auVar108._8_4_ * fVar174;
                auVar69._8_4_ = fVar174;
                fVar175 = auVar108._12_4_ * fVar175;
                auVar69._12_4_ = fVar175;
                fVar140 = auVar108._16_4_ * 0.0;
                auVar69._16_4_ = fVar140;
                fVar141 = auVar108._20_4_ * 0.0;
                auVar69._20_4_ = fVar141;
                fVar142 = auVar108._24_4_ * 0.0;
                auVar69._24_4_ = fVar142;
                auVar69._28_4_ = auVar108._28_4_;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = &DAT_3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx512vl(auVar181,auVar68);
                bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar19 = SUB81(uVar83 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar102._28_4_ |
                                              (uint)!bVar19 * auVar104._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar139 |
                                                        (uint)!bVar18 * auVar104._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar138 |
                                                                  (uint)!bVar17 * auVar104._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar158 |
                                                                            (uint)!bVar16 *
                                                                            auVar104._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar91 |
                                                                                      (uint)!bVar15
                                                                                      * auVar104.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar166 |
                                                                  (uint)!bVar14 * auVar104._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar159 |
                                                                           (uint)!bVar13 *
                                                                           auVar104._4_4_,
                                                                           (uint)(bVar86 & 1) *
                                                                           (int)fVar176 |
                                                                           (uint)!(bool)(bVar86 & 1)
                                                                           * auVar104._0_4_))))))));
                auVar104 = vsubps_avx(auVar181,auVar69);
                bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar19 = SUB81(uVar83 >> 7,0);
                local_360._4_4_ = (uint)bVar13 * (int)fVar146 | (uint)!bVar13 * auVar104._4_4_;
                local_360._0_4_ =
                     (uint)(bVar86 & 1) * (int)fVar167 | (uint)!(bool)(bVar86 & 1) * auVar104._0_4_;
                local_360._8_4_ = (uint)bVar14 * (int)fVar174 | (uint)!bVar14 * auVar104._8_4_;
                local_360._12_4_ = (uint)bVar15 * (int)fVar175 | (uint)!bVar15 * auVar104._12_4_;
                local_360._16_4_ = (uint)bVar16 * (int)fVar140 | (uint)!bVar16 * auVar104._16_4_;
                local_360._20_4_ = (uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar104._20_4_;
                local_360._24_4_ = (uint)bVar18 * (int)fVar142 | (uint)!bVar18 * auVar104._24_4_;
                local_360._28_4_ = (uint)bVar19 * auVar108._28_4_ | (uint)!bVar19 * auVar104._28_4_;
                in_ZMM21 = ZEXT3264(auVar115);
              }
            }
            auVar199 = ZEXT3264(local_700);
            if (local_3f0 == 0) goto LAB_01d23300;
            auVar104 = vsubps_avx(ZEXT1632(auVar94),auVar99);
            local_5e0 = in_ZMM20._0_32_;
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_5e0,auVar99);
            auVar154._0_4_ = auVar104._0_4_ + auVar104._0_4_;
            auVar154._4_4_ = auVar104._4_4_ + auVar104._4_4_;
            auVar154._8_4_ = auVar104._8_4_ + auVar104._8_4_;
            auVar154._12_4_ = auVar104._12_4_ + auVar104._12_4_;
            auVar154._16_4_ = auVar104._16_4_ + auVar104._16_4_;
            auVar154._20_4_ = auVar104._20_4_ + auVar104._20_4_;
            auVar154._24_4_ = auVar104._24_4_ + auVar104._24_4_;
            auVar154._28_4_ = auVar104._28_4_ + auVar104._28_4_;
            uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar30._4_4_ = uVar147;
            auVar30._0_4_ = uVar147;
            auVar30._8_4_ = uVar147;
            auVar30._12_4_ = uVar147;
            auVar30._16_4_ = uVar147;
            auVar30._20_4_ = uVar147;
            auVar30._24_4_ = uVar147;
            auVar30._28_4_ = uVar147;
            auVar104 = vmulps_avx512vl(auVar154,auVar30);
            local_600 = in_ZMM21._0_32_;
            uVar148 = vcmpps_avx512vl(local_600,auVar104,6);
            local_3f0 = local_3f0 & (byte)uVar148;
            if (local_3f0 == 0) goto LAB_01d23300;
            auVar155._8_4_ = 0xbf800000;
            auVar155._0_8_ = 0xbf800000bf800000;
            auVar155._12_4_ = 0xbf800000;
            auVar155._16_4_ = 0xbf800000;
            auVar155._20_4_ = 0xbf800000;
            auVar155._24_4_ = 0xbf800000;
            auVar155._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_480 = vfmadd132ps_avx512vl(local_360,auVar155,auVar31);
            local_360 = local_480;
            auVar104 = local_360;
            local_440 = (undefined4)lVar87;
            local_420 = local_550._0_8_;
            uStack_418 = local_550._8_8_;
            local_410 = local_560._0_8_;
            uStack_408 = local_560._8_8_;
            local_400 = local_570._0_8_;
            uStack_3f8 = local_570._8_8_;
            pGVar11 = (context->scene->geometries).items[uVar88].ptr;
            local_780 = (undefined1  [8])pGVar11;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              bVar86 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar86 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar115 = vaddps_avx512vl(local_5e0,_DAT_02020f40);
              auVar95 = vcvtsi2ss_avx512f(auVar200._0_16_,local_440);
              fVar167 = auVar95._0_4_;
              local_3e0[0] = (fVar167 + auVar115._0_4_) * local_500;
              local_3e0[1] = (fVar167 + auVar115._4_4_) * fStack_4fc;
              local_3e0[2] = (fVar167 + auVar115._8_4_) * fStack_4f8;
              local_3e0[3] = (fVar167 + auVar115._12_4_) * fStack_4f4;
              fStack_3d0 = (fVar167 + auVar115._16_4_) * fStack_4f0;
              fStack_3cc = (fVar167 + auVar115._20_4_) * fStack_4ec;
              fStack_3c8 = (fVar167 + auVar115._24_4_) * fStack_4e8;
              fStack_3c4 = fVar167 + auVar115._28_4_;
              local_360._0_8_ = local_480._0_8_;
              local_360._8_8_ = local_480._8_8_;
              local_360._16_8_ = local_480._16_8_;
              local_360._24_8_ = local_480._24_8_;
              local_3c0 = local_360._0_8_;
              uStack_3b8 = local_360._8_8_;
              uStack_3b0 = local_360._16_8_;
              uStack_3a8 = local_360._24_8_;
              local_3a0 = local_600;
              local_6a0 = local_550._0_4_;
              fStack_69c = local_550._4_4_;
              fStack_698 = local_550._8_4_;
              fStack_694 = local_550._12_4_;
              uVar83 = 0;
              local_730 = (ulong)local_3f0;
              for (uVar85 = local_730; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000)
              {
                uVar83 = uVar83 + 1;
              }
              local_750 = local_560;
              local_2f0 = local_570._0_8_;
              uStack_2e8 = local_570._8_8_;
              uVar85 = 0x2227201;
              local_688 = lVar87;
              local_4a0 = local_5e0;
              local_460 = local_600;
              local_43c = iVar10;
              local_430 = auVar21;
              local_360 = auVar104;
              do {
                local_740 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_260 = local_3e0[uVar83];
                local_240 = *(undefined4 *)((long)&local_3c0 + uVar83 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar83 * 4);
                local_7b0.context = context->user;
                fVar146 = 1.0 - local_260;
                fVar167 = fVar146 * fVar146 * -3.0;
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),
                                          ZEXT416((uint)(local_260 * fVar146)),ZEXT416(0xc0000000));
                auVar94 = vfmsub132ss_fma(ZEXT416((uint)(local_260 * fVar146)),
                                          ZEXT416((uint)(local_260 * local_260)),ZEXT416(0x40000000)
                                         );
                fVar146 = auVar95._0_4_ * 3.0;
                fVar174 = auVar94._0_4_ * 3.0;
                fVar175 = local_260 * local_260 * 3.0;
                auVar178._0_4_ = fVar175 * (float)local_2f0;
                auVar178._4_4_ = fVar175 * local_2f0._4_4_;
                auVar178._8_4_ = fVar175 * (float)uStack_2e8;
                auVar178._12_4_ = fVar175 * uStack_2e8._4_4_;
                auVar151._4_4_ = fVar174;
                auVar151._0_4_ = fVar174;
                auVar151._8_4_ = fVar174;
                auVar151._12_4_ = fVar174;
                auVar95 = vfmadd132ps_fma(auVar151,auVar178,local_750);
                auVar163._4_4_ = fVar146;
                auVar163._0_4_ = fVar146;
                auVar163._8_4_ = fVar146;
                auVar163._12_4_ = fVar146;
                auVar78._4_4_ = fStack_69c;
                auVar78._0_4_ = local_6a0;
                auVar78._8_4_ = fStack_698;
                auVar78._12_4_ = fStack_694;
                auVar95 = vfmadd132ps_fma(auVar163,auVar95,auVar78);
                auVar152._4_4_ = fVar167;
                auVar152._0_4_ = fVar167;
                auVar152._8_4_ = fVar167;
                auVar152._12_4_ = fVar167;
                auVar95 = vfmadd213ps_fma(auVar152,auVar21,auVar95);
                local_2c0 = auVar95._0_4_;
                auVar173._8_4_ = 1;
                auVar173._0_8_ = 0x100000001;
                auVar173._12_4_ = 1;
                auVar173._16_4_ = 1;
                auVar173._20_4_ = 1;
                auVar173._24_4_ = 1;
                auVar173._28_4_ = 1;
                local_2a0 = vpermps_avx2(auVar173,ZEXT1632(auVar95));
                auVar182._8_4_ = 2;
                auVar182._0_8_ = 0x200000002;
                auVar182._12_4_ = 2;
                auVar182._16_4_ = 2;
                auVar182._20_4_ = 2;
                auVar182._24_4_ = 2;
                auVar182._28_4_ = 2;
                local_280 = vpermps_avx2(auVar182,ZEXT1632(auVar95));
                uStack_2bc = local_2c0;
                uStack_2b8 = local_2c0;
                uStack_2b4 = local_2c0;
                uStack_2b0 = local_2c0;
                uStack_2ac = local_2c0;
                uStack_2a8 = local_2c0;
                uStack_2a4 = local_2c0;
                fStack_25c = local_260;
                fStack_258 = local_260;
                fStack_254 = local_260;
                fStack_250 = local_260;
                fStack_24c = local_260;
                fStack_248 = local_260;
                fStack_244 = local_260;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                local_220 = local_380._0_8_;
                uStack_218 = local_380._8_8_;
                uStack_210 = local_380._16_8_;
                uStack_208 = local_380._24_8_;
                local_200 = local_4c0;
                vpcmpeqd_avx2(local_4c0,local_4c0);
                local_1e0 = (local_7b0.context)->instID[0];
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = (local_7b0.context)->instPrimID[0];
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_6c0 = local_2e0._0_8_;
                uStack_6b8 = local_2e0._8_8_;
                uStack_6b0 = local_2e0._16_8_;
                uStack_6a8 = local_2e0._24_8_;
                local_7b0.valid = (int *)&local_6c0;
                local_7b0.geometryUserPtr = *(void **)((long)local_780 + 0x18);
                local_7b0.hit = (RTCHitN *)&local_2c0;
                local_7b0.N = 8;
                local_520._0_4_ = (int)uVar85;
                local_540._0_8_ = uVar83;
                uVar84 = uVar83;
                local_7b0.ray = (RTCRayN *)ray;
                if (*(code **)((long)local_780 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_780 + 0x48))(&local_7b0);
                  uVar85 = (ulong)(uint)local_520._0_4_;
                  uVar84 = local_540._0_8_;
                }
                auVar76._8_8_ = uStack_6b8;
                auVar76._0_8_ = local_6c0;
                auVar76._16_8_ = uStack_6b0;
                auVar76._24_8_ = uStack_6a8;
                if (auVar76 != (undefined1  [32])0x0) {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_7b0);
                    uVar85 = (ulong)(uint)local_520._0_4_;
                    uVar84 = local_540._0_8_;
                  }
                  auVar95 = auVar202._0_16_;
                  auVar77._8_8_ = uStack_6b8;
                  auVar77._0_8_ = local_6c0;
                  auVar77._16_8_ = uStack_6b0;
                  auVar77._24_8_ = uStack_6a8;
                  uVar83 = vptestmd_avx512vl(auVar77,auVar77);
                  auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar83 & 1);
                  auVar137._0_4_ =
                       (uint)bVar13 * auVar104._0_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x100);
                  bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar137._4_4_ =
                       (uint)bVar13 * auVar104._4_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x104);
                  bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar137._8_4_ =
                       (uint)bVar13 * auVar104._8_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x108);
                  bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar137._12_4_ =
                       (uint)bVar13 * auVar104._12_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x10c);
                  bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar137._16_4_ =
                       (uint)bVar13 * auVar104._16_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x110);
                  bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar137._20_4_ =
                       (uint)bVar13 * auVar104._20_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x114);
                  bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar137._24_4_ =
                       (uint)bVar13 * auVar104._24_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x118);
                  bVar13 = SUB81(uVar83 >> 7,0);
                  auVar137._28_4_ =
                       (uint)bVar13 * auVar104._28_4_ |
                       (uint)!bVar13 * *(int *)(local_7b0.ray + 0x11c);
                  *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar137;
                  if (auVar77 != (undefined1  [32])0x0) break;
                }
                auVar95 = auVar202._0_16_;
                *(undefined4 *)(ray + k * 4 + 0x100) = local_740;
                uVar83 = 0;
                local_730 = local_730 ^ 1L << (uVar84 & 0x3f);
                for (uVar84 = local_730; (uVar84 & 1) == 0;
                    uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                  uVar83 = uVar83 + 1;
                }
                uVar85 = CONCAT71((int7)(uVar85 >> 8),local_730 != 0);
              } while (local_730 != 0);
              bVar86 = (byte)uVar85 & 1;
              auVar95 = vxorps_avx512vl(auVar95,auVar95);
              auVar202 = ZEXT1664(auVar95);
              in_ZMM20 = ZEXT3264(local_5e0);
              in_ZMM21 = ZEXT3264(local_600);
              auVar201 = ZEXT3264(local_5a0);
              auVar195 = ZEXT3264(local_5c0);
              auVar199 = ZEXT3264(local_700);
              auVar203 = ZEXT3264(local_640);
              auVar204 = ZEXT3264(local_660);
              lVar87 = local_688;
            }
            uVar82 = CONCAT31(local_720._1_3_,local_720[0] | bVar86);
          }
          auVar184 = ZEXT3264(auVar103);
          auVar157 = ZEXT3264(auVar105);
          uVar83 = (ulong)uVar82;
          lVar87 = lVar87 + 8;
          auVar200 = auVar195;
        } while ((int)lVar87 < iVar10);
      }
      if ((uVar83 & 1) != 0) {
        return bVar90;
      }
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar27._4_4_ = uVar147;
      auVar27._0_4_ = uVar147;
      auVar27._8_4_ = uVar147;
      auVar27._12_4_ = uVar147;
      auVar27._16_4_ = uVar147;
      auVar27._20_4_ = uVar147;
      auVar27._24_4_ = uVar147;
      auVar27._28_4_ = uVar147;
      uVar148 = vcmpps_avx512vl(local_80,auVar27,2);
      uVar88 = (uint)uVar89 & (uint)uVar148;
      uVar89 = (ulong)uVar88;
      bVar90 = uVar88 != 0;
    } while (bVar90);
  }
  return bVar90;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }